

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  byte bVar72;
  byte bVar73;
  ulong uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  long lVar78;
  Geometry *pGVar79;
  long lVar80;
  uint uVar81;
  ulong uVar82;
  byte bVar83;
  float fVar84;
  float fVar85;
  float fVar136;
  float fVar138;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar96 [16];
  float fVar137;
  float fVar139;
  float fVar141;
  float fVar142;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar140;
  float fVar143;
  float fVar144;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined4 uVar145;
  undefined8 uVar146;
  vint4 bi_2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 bi_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  vint4 bi;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar174;
  float fVar180;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  float fVar181;
  float fVar188;
  float fVar189;
  vint4 ai_2;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar190;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  vint4 ai_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined4 uVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_604;
  Primitive *local_600;
  ulong local_5f8;
  ulong local_5f0;
  Precalculations *local_5e8;
  RTCFilterFunctionNArguments local_5e0;
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  undefined4 local_598;
  float local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  uint local_584;
  uint local_580;
  Geometry *local_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  undefined8 uStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  float local_490;
  undefined4 uStack_48c;
  undefined8 uStack_488;
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  byte local_230;
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar7 = prim[1];
  uVar74 = (ulong)(byte)PVar7;
  lVar27 = uVar74 * 0x25;
  fVar174 = *(float *)(prim + lVar27 + 0x12);
  auVar93 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar27 + 6));
  auVar160._0_4_ = fVar174 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar160._4_4_ = fVar174 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar160._8_4_ = fVar174 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar160._12_4_ = fVar174 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 4 + 6)));
  auVar182._0_4_ = fVar174 * auVar93._0_4_;
  auVar182._4_4_ = fVar174 * auVar93._4_4_;
  auVar182._8_4_ = fVar174 * auVar93._8_4_;
  auVar182._12_4_ = fVar174 * auVar93._12_4_;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 5 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0xf + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar74 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1a + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1b + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 * 0x1c + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar191._4_4_ = auVar160._0_4_;
  auVar191._0_4_ = auVar160._0_4_;
  auVar191._8_4_ = auVar160._0_4_;
  auVar191._12_4_ = auVar160._0_4_;
  auVar24 = vshufps_avx(auVar160,auVar160,0x55);
  auVar25 = vshufps_avx(auVar160,auVar160,0xaa);
  fVar174 = auVar25._0_4_;
  auVar161._0_4_ = fVar174 * auVar87._0_4_;
  fVar181 = auVar25._4_4_;
  auVar161._4_4_ = fVar181 * auVar87._4_4_;
  fVar188 = auVar25._8_4_;
  auVar161._8_4_ = fVar188 * auVar87._8_4_;
  fVar189 = auVar25._12_4_;
  auVar161._12_4_ = fVar189 * auVar87._12_4_;
  auVar156._0_4_ = auVar88._0_4_ * fVar174;
  auVar156._4_4_ = auVar88._4_4_ * fVar181;
  auVar156._8_4_ = auVar88._8_4_ * fVar188;
  auVar156._12_4_ = auVar88._12_4_ * fVar189;
  auVar96._0_4_ = auVar89._0_4_ * fVar174;
  auVar96._4_4_ = auVar89._4_4_ * fVar181;
  auVar96._8_4_ = auVar89._8_4_ * fVar188;
  auVar96._12_4_ = auVar89._12_4_ * fVar189;
  auVar25 = vfmadd231ps_fma(auVar161,auVar24,auVar93);
  auVar28 = vfmadd231ps_fma(auVar156,auVar24,auVar21);
  auVar24 = vfmadd231ps_fma(auVar96,auVar23,auVar24);
  auVar25 = vfmadd231ps_fma(auVar25,auVar191,auVar94);
  auVar28 = vfmadd231ps_fma(auVar28,auVar191,auVar20);
  auVar29 = vfmadd231ps_fma(auVar24,auVar22,auVar191);
  auVar214._4_4_ = auVar182._0_4_;
  auVar214._0_4_ = auVar182._0_4_;
  auVar214._8_4_ = auVar182._0_4_;
  auVar214._12_4_ = auVar182._0_4_;
  auVar24 = vshufps_avx(auVar182,auVar182,0x55);
  auVar86 = vshufps_avx512vl(auVar182,auVar182,0xaa);
  auVar87 = vmulps_avx512vl(auVar86,auVar87);
  auVar88 = vmulps_avx512vl(auVar86,auVar88);
  auVar89 = vmulps_avx512vl(auVar86,auVar89);
  auVar93 = vfmadd231ps_fma(auVar87,auVar24,auVar93);
  auVar87 = vfmadd231ps_fma(auVar88,auVar24,auVar21);
  auVar21 = vfmadd231ps_fma(auVar89,auVar24,auVar23);
  auVar30 = vfmadd231ps_fma(auVar93,auVar214,auVar94);
  auVar96 = vfmadd231ps_fma(auVar87,auVar214,auVar20);
  auVar204._8_4_ = 0x7fffffff;
  auVar204._0_8_ = 0x7fffffff7fffffff;
  auVar204._12_4_ = 0x7fffffff;
  auVar147 = vfmadd231ps_fma(auVar21,auVar214,auVar22);
  auVar94 = vandps_avx(auVar204,auVar25);
  auVar201._8_4_ = 0x219392ef;
  auVar201._0_8_ = 0x219392ef219392ef;
  auVar201._12_4_ = 0x219392ef;
  uVar82 = vcmpps_avx512vl(auVar94,auVar201,1);
  bVar13 = (bool)((byte)uVar82 & 1);
  auVar90._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar25._0_4_;
  bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar25._4_4_;
  bVar13 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar25._8_4_;
  bVar13 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar25._12_4_;
  auVar94 = vandps_avx(auVar204,auVar28);
  uVar82 = vcmpps_avx512vl(auVar94,auVar201,1);
  bVar13 = (bool)((byte)uVar82 & 1);
  auVar91._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._0_4_;
  bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._4_4_;
  bVar13 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._8_4_;
  bVar13 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._12_4_;
  auVar94 = vandps_avx(auVar204,auVar29);
  uVar82 = vcmpps_avx512vl(auVar94,auVar201,1);
  bVar13 = (bool)((byte)uVar82 & 1);
  auVar92._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._0_4_;
  bVar13 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._4_4_;
  bVar13 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._8_4_;
  bVar13 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._12_4_;
  auVar93 = vrcp14ps_avx512vl(auVar90);
  auVar202._8_4_ = 0x3f800000;
  auVar202._0_8_ = &DAT_3f8000003f800000;
  auVar202._12_4_ = 0x3f800000;
  auVar94 = vfnmadd213ps_fma(auVar90,auVar93,auVar202);
  auVar29 = vfmadd132ps_fma(auVar94,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar91);
  auVar94 = vfnmadd213ps_fma(auVar91,auVar93,auVar202);
  auVar86 = vfmadd132ps_fma(auVar94,auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar92);
  auVar94 = vfnmadd213ps_fma(auVar92,auVar93,auVar202);
  auVar95 = vfmadd132ps_fma(auVar94,auVar93,auVar93);
  fVar174 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar199._4_4_ = fVar174;
  auVar199._0_4_ = fVar174;
  auVar199._8_4_ = fVar174;
  auVar199._12_4_ = fVar174;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar74 * 7 + 6);
  auVar94 = vpmovsxwd_avx(auVar94);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar93 = vpmovsxwd_avx(auVar93);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar20 = vsubps_avx(auVar93,auVar94);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar74 * 9 + 6);
  auVar93 = vpmovsxwd_avx(auVar87);
  auVar87 = vfmadd213ps_fma(auVar20,auVar199,auVar94);
  auVar94 = vcvtdq2ps_avx(auVar93);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar74 * 0xd + 6);
  auVar93 = vpmovsxwd_avx(auVar20);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,auVar94);
  auVar20 = vfmadd213ps_fma(auVar93,auVar199,auVar94);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar74 * 0x12 + 6);
  auVar94 = vpmovsxwd_avx(auVar21);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar82 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar74 * 2 + uVar82 + 6);
  auVar93 = vpmovsxwd_avx(auVar88);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,auVar94);
  auVar21 = vfmadd213ps_fma(auVar93,auVar199,auVar94);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar94 = vpmovsxwd_avx(auVar22);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar74 * 0x18 + 6);
  auVar93 = vpmovsxwd_avx(auVar23);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,auVar94);
  auVar88 = vfmadd213ps_fma(auVar93,auVar199,auVar94);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar74 * 0x1d + 6);
  auVar94 = vpmovsxwd_avx(auVar89);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar74 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar93 = vpmovsxwd_avx(auVar24);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,auVar94);
  auVar22 = vfmadd213ps_fma(auVar93,auVar199,auVar94);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar74) + 6);
  auVar94 = vpmovsxwd_avx(auVar25);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar74 * 0x23 + 6);
  auVar93 = vpmovsxwd_avx(auVar28);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,auVar94);
  auVar93 = vfmadd213ps_fma(auVar93,auVar199,auVar94);
  auVar94 = vsubps_avx(auVar87,auVar30);
  auVar200._0_4_ = auVar29._0_4_ * auVar94._0_4_;
  auVar200._4_4_ = auVar29._4_4_ * auVar94._4_4_;
  auVar200._8_4_ = auVar29._8_4_ * auVar94._8_4_;
  auVar200._12_4_ = auVar29._12_4_ * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar20,auVar30);
  auVar162._0_4_ = auVar29._0_4_ * auVar94._0_4_;
  auVar162._4_4_ = auVar29._4_4_ * auVar94._4_4_;
  auVar162._8_4_ = auVar29._8_4_ * auVar94._8_4_;
  auVar162._12_4_ = auVar29._12_4_ * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar21,auVar96);
  auVar192._0_4_ = auVar86._0_4_ * auVar94._0_4_;
  auVar192._4_4_ = auVar86._4_4_ * auVar94._4_4_;
  auVar192._8_4_ = auVar86._8_4_ * auVar94._8_4_;
  auVar192._12_4_ = auVar86._12_4_ * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar88,auVar96);
  auVar157._0_4_ = auVar86._0_4_ * auVar94._0_4_;
  auVar157._4_4_ = auVar86._4_4_ * auVar94._4_4_;
  auVar157._8_4_ = auVar86._8_4_ * auVar94._8_4_;
  auVar157._12_4_ = auVar86._12_4_ * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar22,auVar147);
  auVar183._0_4_ = auVar95._0_4_ * auVar94._0_4_;
  auVar183._4_4_ = auVar95._4_4_ * auVar94._4_4_;
  auVar183._8_4_ = auVar95._8_4_ * auVar94._8_4_;
  auVar183._12_4_ = auVar95._12_4_ * auVar94._12_4_;
  auVar94 = vsubps_avx(auVar93,auVar147);
  auVar147._0_4_ = auVar95._0_4_ * auVar94._0_4_;
  auVar147._4_4_ = auVar95._4_4_ * auVar94._4_4_;
  auVar147._8_4_ = auVar95._8_4_ * auVar94._8_4_;
  auVar147._12_4_ = auVar95._12_4_ * auVar94._12_4_;
  auVar94 = vpminsd_avx(auVar200,auVar162);
  auVar93 = vpminsd_avx(auVar192,auVar157);
  auVar94 = vmaxps_avx(auVar94,auVar93);
  auVar93 = vpminsd_avx(auVar183,auVar147);
  uVar145 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar29._4_4_ = uVar145;
  auVar29._0_4_ = uVar145;
  auVar29._8_4_ = uVar145;
  auVar29._12_4_ = uVar145;
  auVar93 = vmaxps_avx512vl(auVar93,auVar29);
  auVar94 = vmaxps_avx(auVar94,auVar93);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  local_170 = vmulps_avx512vl(auVar94,auVar86);
  auVar94 = vpmaxsd_avx(auVar200,auVar162);
  auVar93 = vpmaxsd_avx(auVar192,auVar157);
  auVar94 = vminps_avx(auVar94,auVar93);
  auVar93 = vpmaxsd_avx(auVar183,auVar147);
  fVar174 = (ray->super_RayK<1>).tfar;
  auVar95._4_4_ = fVar174;
  auVar95._0_4_ = fVar174;
  auVar95._8_4_ = fVar174;
  auVar95._12_4_ = fVar174;
  auVar93 = vminps_avx512vl(auVar93,auVar95);
  auVar94 = vminps_avx(auVar94,auVar93);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar30);
  local_5e8 = pre;
  auVar93 = vpbroadcastd_avx512vl();
  uVar146 = vcmpps_avx512vl(local_170,auVar94,2);
  uVar82 = vpcmpgtd_avx512vl(auVar93,_DAT_01ff0cf0);
  uVar82 = ((byte)uVar146 & 0xf) & uVar82;
  if ((char)uVar82 != '\0') {
    do {
      lVar27 = 0;
      for (uVar74 = uVar82; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar81 = *(uint *)(prim + 2);
      uVar77 = *(uint *)(prim + lVar27 * 4 + 6);
      local_5f8 = (ulong)uVar81;
      pGVar79 = (context->scene->geometries).items[uVar81].ptr;
      local_5f0 = (ulong)uVar77;
      uVar74 = (ulong)*(uint *)(*(long *)&pGVar79->field_0x58 +
                               (ulong)uVar77 *
                               pGVar79[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar174 = (pGVar79->time_range).lower;
      fVar174 = pGVar79->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar174) /
                ((pGVar79->time_range).upper - fVar174));
      auVar94 = vroundss_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),9);
      auVar94 = vminss_avx(auVar94,ZEXT416((uint)(pGVar79->fnumTimeSegments + -1.0)));
      auVar94 = vmaxss_avx(ZEXT816(0) << 0x20,auVar94);
      fVar174 = fVar174 - auVar94._0_4_;
      fVar181 = 1.0 - fVar174;
      _Var9 = pGVar79[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar78 = (long)(int)auVar94._0_4_ * 0x38;
      lVar80 = *(long *)(_Var9 + 0x10 + lVar78);
      lVar10 = *(long *)(_Var9 + 0x38 + lVar78);
      lVar11 = *(long *)(_Var9 + 0x48 + lVar78);
      auVar148._4_4_ = fVar174;
      auVar148._0_4_ = fVar174;
      auVar148._8_4_ = fVar174;
      auVar148._12_4_ = fVar174;
      pfVar3 = (float *)(lVar10 + lVar11 * uVar74);
      auVar205._0_4_ = fVar174 * *pfVar3;
      auVar205._4_4_ = fVar174 * pfVar3[1];
      auVar205._8_4_ = fVar174 * pfVar3[2];
      auVar205._12_4_ = fVar174 * pfVar3[3];
      lVar27 = uVar74 + 1;
      auVar158._4_4_ = fVar181;
      auVar158._0_4_ = fVar181;
      auVar158._8_4_ = fVar181;
      auVar158._12_4_ = fVar181;
      local_5b0 = vfmadd231ps_fma(auVar205,auVar158,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var9 + lVar78) + lVar80 * uVar74));
      p_Var12 = pGVar79[4].occlusionFilterN;
      auVar94 = vmulps_avx512vl(auVar148,*(undefined1 (*) [16])(lVar10 + lVar11 * lVar27));
      _local_530 = vfmadd231ps_avx512vl
                             (auVar94,auVar158,
                              *(undefined1 (*) [16])(*(long *)(_Var9 + lVar78) + lVar80 * lVar27));
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar78 + 0x38) +
                        uVar74 * *(long *)(p_Var12 + lVar78 + 0x48));
      auVar206._0_4_ = fVar174 * *pfVar3;
      auVar206._4_4_ = fVar174 * pfVar3[1];
      auVar206._8_4_ = fVar174 * pfVar3[2];
      auVar206._12_4_ = fVar174 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var12 + lVar78 + 0x38) +
                        *(long *)(p_Var12 + lVar78 + 0x48) * lVar27);
      auVar209._0_4_ = fVar174 * *pfVar3;
      auVar209._4_4_ = fVar174 * pfVar3[1];
      auVar209._8_4_ = fVar174 * pfVar3[2];
      auVar209._12_4_ = fVar174 * pfVar3[3];
      auVar94 = vfmadd231ps_fma(auVar206,auVar158,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var12 + lVar78) +
                                 *(long *)(p_Var12 + lVar78 + 0x10) * uVar74));
      auVar93 = vfmadd231ps_fma(auVar209,auVar158,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var12 + lVar78) +
                                 *(long *)(p_Var12 + lVar78 + 0x10) * lVar27));
      iVar8 = (int)pGVar79[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar27 = (long)iVar8 * 0x44;
      auVar149._8_4_ = 0xbeaaaaab;
      auVar149._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar149._12_4_ = 0xbeaaaaab;
      local_540 = vfnmadd213ps_fma(auVar94,auVar149,local_5b0);
      local_550 = vfmadd213ps_avx512vl(auVar93,auVar149,_local_530);
      aVar4 = (ray->super_RayK<1>).org.field_0;
      auVar93 = vsubps_avx(local_5b0,(undefined1  [16])aVar4);
      uVar145 = auVar93._0_4_;
      auVar163._4_4_ = uVar145;
      auVar163._0_4_ = uVar145;
      auVar163._8_4_ = uVar145;
      auVar163._12_4_ = uVar145;
      auVar94 = vshufps_avx(auVar93,auVar93,0x55);
      aVar5 = (local_5e8->ray_space).vx.field_0;
      aVar6 = (local_5e8->ray_space).vy.field_0;
      fVar174 = (local_5e8->ray_space).vz.field_0.m128[0];
      fVar181 = (local_5e8->ray_space).vz.field_0.m128[1];
      fVar188 = (local_5e8->ray_space).vz.field_0.m128[2];
      fVar189 = (local_5e8->ray_space).vz.field_0.m128[3];
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar208._0_4_ = auVar93._0_4_ * fVar174;
      auVar208._4_4_ = auVar93._4_4_ * fVar181;
      auVar208._8_4_ = auVar93._8_4_ * fVar188;
      auVar208._12_4_ = auVar93._12_4_ * fVar189;
      auVar94 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar6,auVar94);
      auVar87 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar5,auVar163);
      auVar93 = vsubps_avx(local_540,(undefined1  [16])aVar4);
      uVar145 = auVar93._0_4_;
      auVar164._4_4_ = uVar145;
      auVar164._0_4_ = uVar145;
      auVar164._8_4_ = uVar145;
      auVar164._12_4_ = uVar145;
      auVar94 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar210._0_4_ = auVar93._0_4_ * fVar174;
      auVar210._4_4_ = auVar93._4_4_ * fVar181;
      auVar210._8_4_ = auVar93._8_4_ * fVar188;
      auVar210._12_4_ = auVar93._12_4_ * fVar189;
      auVar94 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar6,auVar94);
      auVar20 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar5,auVar164);
      auVar93 = vsubps_avx(local_550,(undefined1  [16])aVar4);
      uVar145 = auVar93._0_4_;
      auVar165._4_4_ = uVar145;
      auVar165._0_4_ = uVar145;
      auVar165._8_4_ = uVar145;
      auVar165._12_4_ = uVar145;
      auVar94 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar211._0_4_ = fVar174 * auVar93._0_4_;
      auVar211._4_4_ = fVar181 * auVar93._4_4_;
      auVar211._8_4_ = fVar188 * auVar93._8_4_;
      auVar211._12_4_ = fVar189 * auVar93._12_4_;
      auVar94 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar6,auVar94);
      auVar21 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar5,auVar165);
      auVar93 = vsubps_avx512vl(_local_530,(undefined1  [16])aVar4);
      uVar145 = auVar93._0_4_;
      auVar159._4_4_ = uVar145;
      auVar159._0_4_ = uVar145;
      auVar159._8_4_ = uVar145;
      auVar159._12_4_ = uVar145;
      auVar94 = vshufps_avx(auVar93,auVar93,0x55);
      auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
      auVar216._0_4_ = auVar93._0_4_ * fVar174;
      auVar216._4_4_ = auVar93._4_4_ * fVar181;
      auVar216._8_4_ = auVar93._8_4_ * fVar188;
      auVar216._12_4_ = auVar93._12_4_ * fVar189;
      auVar94 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar6,auVar94);
      auVar88 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar5,auVar159);
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      uVar145 = auVar87._0_4_;
      local_3c0._4_4_ = uVar145;
      local_3c0._0_4_ = uVar145;
      local_3c0._8_4_ = uVar145;
      local_3c0._12_4_ = uVar145;
      local_3c0._16_4_ = uVar145;
      local_3c0._20_4_ = uVar145;
      local_3c0._24_4_ = uVar145;
      local_3c0._28_4_ = uVar145;
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      auVar97._8_4_ = 1;
      auVar97._0_8_ = 0x100000001;
      auVar97._12_4_ = 1;
      auVar97._16_4_ = 1;
      auVar97._20_4_ = 1;
      auVar97._24_4_ = 1;
      auVar97._28_4_ = 1;
      local_340 = vpermps_avx2(auVar97,ZEXT1632(auVar87));
      local_3e0 = vbroadcastss_avx512vl(auVar20);
      local_360 = vpermps_avx512vl(auVar97,ZEXT1632(auVar20));
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_400 = vbroadcastss_avx512vl(auVar21);
      local_420 = vpermps_avx512vl(auVar97,ZEXT1632(auVar21));
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      uVar145 = auVar88._0_4_;
      local_380._4_4_ = uVar145;
      local_380._0_4_ = uVar145;
      local_380._8_4_ = uVar145;
      local_380._12_4_ = uVar145;
      local_380._16_4_ = uVar145;
      local_380._20_4_ = uVar145;
      local_380._24_4_ = uVar145;
      local_380._28_4_ = uVar145;
      local_3a0 = vpermps_avx2(auVar97,ZEXT1632(auVar88));
      auVar97 = vmulps_avx512vl(local_380,auVar109);
      auVar98 = vmulps_avx512vl(local_3a0,auVar109);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,local_400);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar110,local_420);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar114,local_3e0);
      auVar99 = vfmadd231ps_avx512vl(auVar98,auVar114,local_360);
      auVar100 = vfmadd231ps_avx512vl(auVar97,auVar112,local_3c0);
      auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar101 = vfmadd231ps_avx512vl(auVar99,auVar112,local_340);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar227 = ZEXT3264(local_380);
      auVar102 = vmulps_avx512vl(local_380,auVar99);
      auVar228 = ZEXT3264(local_3a0);
      auVar103 = vmulps_avx512vl(local_3a0,auVar99);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_400);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_420);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,local_3e0);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,local_360);
      auVar22 = vfmadd231ps_fma(auVar102,auVar97,local_3c0);
      auVar23 = vfmadd231ps_fma(auVar103,auVar97,local_340);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar22),auVar100);
      auVar104 = vsubps_avx512vl(ZEXT1632(auVar23),auVar101);
      auVar102 = vmulps_avx512vl(auVar101,auVar103);
      auVar105 = vmulps_avx512vl(auVar100,auVar104);
      auVar102 = vsubps_avx512vl(auVar102,auVar105);
      auVar94 = vshufps_avx(local_5b0,local_5b0,0xff);
      uVar146 = auVar94._0_8_;
      local_80._8_8_ = uVar146;
      local_80._0_8_ = uVar146;
      local_80._16_8_ = uVar146;
      local_80._24_8_ = uVar146;
      auVar94 = vshufps_avx(local_540,local_540,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx(local_550,local_550,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar94);
      auVar94 = vshufps_avx512vl(_local_530,_local_530,0xff);
      uVar146 = auVar94._0_8_;
      register0x00001248 = uVar146;
      local_e0 = uVar146;
      register0x00001250 = uVar146;
      register0x00001258 = uVar146;
      auVar105 = vmulps_avx512vl(_local_e0,auVar109);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,local_c0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar114,local_a0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_80);
      auVar106 = vmulps_avx512vl(_local_e0,auVar99);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar108,local_c0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,local_a0);
      auVar89 = vfmadd231ps_fma(auVar106,auVar97,local_80);
      auVar106 = vmulps_avx512vl(auVar104,auVar104);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar103);
      auVar107 = vmaxps_avx512vl(auVar105,ZEXT1632(auVar89));
      auVar107 = vmulps_avx512vl(auVar107,auVar107);
      auVar106 = vmulps_avx512vl(auVar107,auVar106);
      auVar102 = vmulps_avx512vl(auVar102,auVar102);
      uVar146 = vcmpps_avx512vl(auVar102,auVar106,2);
      auVar24 = local_5b0;
      auVar94 = vblendps_avx(auVar87,local_5b0,8);
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar93 = vandps_avx512vl(auVar94,auVar86);
      auVar28 = local_540;
      auVar94 = vblendps_avx(auVar20,local_540,8);
      auVar94 = vandps_avx512vl(auVar94,auVar86);
      auVar93 = vmaxps_avx(auVar93,auVar94);
      auVar25 = local_550;
      auVar94 = vblendps_avx(auVar21,local_550,8);
      auVar95 = vandps_avx512vl(auVar94,auVar86);
      auVar29 = _local_530;
      auVar94 = vblendps_avx(auVar88,_local_530,8);
      auVar94 = vandps_avx512vl(auVar94,auVar86);
      auVar94 = vmaxps_avx(auVar95,auVar94);
      auVar94 = vmaxps_avx(auVar93,auVar94);
      auVar93 = vmovshdup_avx(auVar94);
      auVar93 = vmaxss_avx(auVar93,auVar94);
      auVar94 = vshufpd_avx(auVar94,auVar94,1);
      auVar94 = vmaxss_avx(auVar94,auVar93);
      _local_300 = vcvtsi2ss_avx512f(_local_530,iVar8);
      auVar106._0_4_ = local_300._0_4_;
      auVar106._4_4_ = auVar106._0_4_;
      auVar106._8_4_ = auVar106._0_4_;
      auVar106._12_4_ = auVar106._0_4_;
      auVar106._16_4_ = auVar106._0_4_;
      auVar106._20_4_ = auVar106._0_4_;
      auVar106._24_4_ = auVar106._0_4_;
      auVar106._28_4_ = auVar106._0_4_;
      uVar26 = vcmpps_avx512vl(auVar106,_DAT_02020f40,0xe);
      bVar83 = (byte)uVar146 & (byte)uVar26;
      _local_560 = vmulss_avx512f(auVar94,ZEXT416(0x35000000));
      auVar102._8_4_ = 2;
      auVar102._0_8_ = 0x200000002;
      auVar102._12_4_ = 2;
      auVar102._16_4_ = 2;
      auVar102._20_4_ = 2;
      auVar102._24_4_ = 2;
      auVar102._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar102,ZEXT1632(auVar87));
      local_120 = vpermps_avx512vl(auVar102,ZEXT1632(auVar20));
      local_140 = vpermps_avx512vl(auVar102,ZEXT1632(auVar21));
      auVar102 = vpermps_avx2(auVar102,ZEXT1632(auVar88));
      uVar145 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar94 = local_100._0_16_;
      uVar213 = local_560._0_4_;
      if (bVar83 == 0) {
        auVar94 = vxorps_avx512vl(auVar94,auVar94);
        auVar221 = ZEXT1664(auVar94);
        auVar220 = ZEXT3264(local_3c0);
        auVar222 = ZEXT3264(local_340);
        auVar223 = ZEXT3264(local_3e0);
        auVar224 = ZEXT3264(local_360);
        auVar225 = ZEXT3264(local_400);
        auVar226 = ZEXT3264(local_420);
        local_5b0 = auVar24;
        _local_530 = auVar29;
      }
      else {
        local_480 = uVar145;
        uStack_47c = 0;
        uStack_478 = 0;
        uStack_474 = 0;
        auVar99 = vmulps_avx512vl(auVar102,auVar99);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar99);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar108);
        auVar107 = vfmadd213ps_avx512vl(auVar97,local_100,auVar98);
        auVar109 = vmulps_avx512vl(auVar102,auVar109);
        auVar110 = vfmadd213ps_avx512vl(auVar110,local_140,auVar109);
        auVar98 = vfmadd213ps_avx512vl(auVar114,local_120,auVar110);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar111 = vfmadd213ps_avx512vl(auVar112,local_100,auVar98);
        auVar112 = vmulps_avx512vl(local_380,auVar97);
        auVar98 = vmulps_avx512vl(local_3a0,auVar97);
        auVar212._0_4_ = auVar102._0_4_ * auVar97._0_4_;
        auVar212._4_4_ = auVar102._4_4_ * auVar97._4_4_;
        auVar212._8_4_ = auVar102._8_4_ * auVar97._8_4_;
        auVar212._12_4_ = auVar102._12_4_ * auVar97._12_4_;
        auVar212._16_4_ = auVar102._16_4_ * auVar97._16_4_;
        auVar212._20_4_ = auVar102._20_4_ * auVar97._20_4_;
        auVar212._24_4_ = auVar102._24_4_ * auVar97._24_4_;
        auVar212._28_4_ = 0;
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,local_400);
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar109,local_420);
        auVar109 = vfmadd231ps_avx512vl(auVar212,local_140,auVar109);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_3e0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,local_360);
        auVar98 = vfmadd231ps_avx512vl(auVar109,local_120,auVar110);
        auVar220 = ZEXT3264(local_3c0);
        auVar108 = vfmadd231ps_avx512vl(auVar112,auVar114,local_3c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar114,local_340);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar98 = vfmadd231ps_avx512vl(auVar98,local_100,auVar114);
        auVar99 = vmulps_avx512vl(local_380,auVar109);
        auVar113 = vmulps_avx512vl(local_3a0,auVar109);
        local_460 = auVar102;
        auVar114._4_4_ = auVar102._4_4_ * auVar109._4_4_;
        auVar114._0_4_ = auVar102._0_4_ * auVar109._0_4_;
        auVar114._8_4_ = auVar102._8_4_ * auVar109._8_4_;
        auVar114._12_4_ = auVar102._12_4_ * auVar109._12_4_;
        auVar114._16_4_ = auVar102._16_4_ * auVar109._16_4_;
        auVar114._20_4_ = auVar102._20_4_ * auVar109._20_4_;
        auVar114._24_4_ = auVar102._24_4_ * auVar109._24_4_;
        auVar114._28_4_ = auVar109._28_4_;
        auVar109 = vfmadd231ps_avx512vl(auVar99,auVar110,local_400);
        auVar99 = vfmadd231ps_avx512vl(auVar113,auVar110,local_420);
        auVar110 = vfmadd231ps_avx512vl(auVar114,local_140,auVar110);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,local_3e0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar114,local_360);
        auVar114 = vfmadd231ps_avx512vl(auVar110,local_120,auVar114);
        auVar110 = vfmadd231ps_avx512vl(auVar109,auVar112,local_3c0);
        auVar109 = vfmadd231ps_avx512vl(auVar99,auVar112,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar114,local_100,auVar112);
        auVar217._8_4_ = 0x7fffffff;
        auVar217._0_8_ = 0x7fffffff7fffffff;
        auVar217._12_4_ = 0x7fffffff;
        auVar217._16_4_ = 0x7fffffff;
        auVar217._20_4_ = 0x7fffffff;
        auVar217._24_4_ = 0x7fffffff;
        auVar217._28_4_ = 0x7fffffff;
        auVar112 = vandps_avx(auVar108,auVar217);
        auVar114 = vandps_avx(auVar97,auVar217);
        auVar114 = vmaxps_avx(auVar112,auVar114);
        auVar112 = vandps_avx(auVar98,auVar217);
        auVar112 = vmaxps_avx(auVar114,auVar112);
        auVar98 = vbroadcastss_avx512vl(_local_560);
        uVar74 = vcmpps_avx512vl(auVar112,auVar98,1);
        bVar13 = (bool)((byte)uVar74 & 1);
        auVar113._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar108._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar108._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar108._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar108._12_4_);
        bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar108._16_4_);
        bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar108._20_4_);
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar108._24_4_);
        bVar13 = SUB81(uVar74 >> 7,0);
        auVar113._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar108._28_4_;
        bVar13 = (bool)((byte)uVar74 & 1);
        auVar115._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar97._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar97._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar97._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar97._12_4_);
        bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar97._16_4_);
        bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar97._20_4_);
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar97._24_4_);
        bVar13 = SUB81(uVar74 >> 7,0);
        auVar115._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar97._28_4_;
        auVar112 = vandps_avx(auVar217,auVar110);
        auVar114 = vandps_avx(auVar109,auVar217);
        auVar114 = vmaxps_avx(auVar112,auVar114);
        auVar112 = vandps_avx(auVar99,auVar217);
        auVar112 = vmaxps_avx(auVar114,auVar112);
        uVar74 = vcmpps_avx512vl(auVar112,auVar98,1);
        bVar13 = (bool)((byte)uVar74 & 1);
        auVar116._0_4_ = (float)((uint)bVar13 * auVar103._0_4_ | (uint)!bVar13 * auVar110._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar110._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar110._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar110._12_4_);
        bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar13 * auVar103._16_4_ | (uint)!bVar13 * auVar110._16_4_);
        bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar13 * auVar103._20_4_ | (uint)!bVar13 * auVar110._20_4_);
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar13 * auVar103._24_4_ | (uint)!bVar13 * auVar110._24_4_);
        bVar13 = SUB81(uVar74 >> 7,0);
        auVar116._28_4_ = (uint)bVar13 * auVar103._28_4_ | (uint)!bVar13 * auVar110._28_4_;
        bVar13 = (bool)((byte)uVar74 & 1);
        auVar117._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar109._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar109._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar109._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar109._12_4_);
        bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar109._16_4_);
        bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar109._20_4_);
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar109._24_4_);
        bVar13 = SUB81(uVar74 >> 7,0);
        auVar117._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar109._28_4_;
        auVar96 = vxorps_avx512vl(auVar94,auVar94);
        auVar221 = ZEXT1664(auVar96);
        auVar112 = vfmadd213ps_avx512vl(auVar113,auVar113,ZEXT1632(auVar96));
        auVar94 = vfmadd231ps_fma(auVar112,auVar115,auVar115);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar174 = auVar114._0_4_;
        fVar181 = auVar114._4_4_;
        fVar188 = auVar114._8_4_;
        fVar189 = auVar114._12_4_;
        fVar190 = auVar114._16_4_;
        fVar180 = auVar114._20_4_;
        fVar84 = auVar114._24_4_;
        auVar112._4_4_ = fVar181 * fVar181 * fVar181 * auVar94._4_4_ * -0.5;
        auVar112._0_4_ = fVar174 * fVar174 * fVar174 * auVar94._0_4_ * -0.5;
        auVar112._8_4_ = fVar188 * fVar188 * fVar188 * auVar94._8_4_ * -0.5;
        auVar112._12_4_ = fVar189 * fVar189 * fVar189 * auVar94._12_4_ * -0.5;
        auVar112._16_4_ = fVar190 * fVar190 * fVar190 * -0.0;
        auVar112._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
        auVar112._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
        auVar112._28_4_ = auVar99._28_4_;
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar97,auVar114);
        auVar110._4_4_ = auVar115._4_4_ * auVar112._4_4_;
        auVar110._0_4_ = auVar115._0_4_ * auVar112._0_4_;
        auVar110._8_4_ = auVar115._8_4_ * auVar112._8_4_;
        auVar110._12_4_ = auVar115._12_4_ * auVar112._12_4_;
        auVar110._16_4_ = auVar115._16_4_ * auVar112._16_4_;
        auVar110._20_4_ = auVar115._20_4_ * auVar112._20_4_;
        auVar110._24_4_ = auVar115._24_4_ * auVar112._24_4_;
        auVar110._28_4_ = 0;
        auVar109._4_4_ = auVar112._4_4_ * -auVar113._4_4_;
        auVar109._0_4_ = auVar112._0_4_ * -auVar113._0_4_;
        auVar109._8_4_ = auVar112._8_4_ * -auVar113._8_4_;
        auVar109._12_4_ = auVar112._12_4_ * -auVar113._12_4_;
        auVar109._16_4_ = auVar112._16_4_ * -auVar113._16_4_;
        auVar109._20_4_ = auVar112._20_4_ * -auVar113._20_4_;
        auVar109._24_4_ = auVar112._24_4_ * -auVar113._24_4_;
        auVar109._28_4_ = auVar115._28_4_;
        auVar112 = vmulps_avx512vl(auVar112,ZEXT1632(auVar96));
        auVar103 = ZEXT1632(auVar96);
        auVar114 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar103);
        auVar94 = vfmadd231ps_fma(auVar114,auVar117,auVar117);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
        fVar174 = auVar114._0_4_;
        fVar181 = auVar114._4_4_;
        fVar188 = auVar114._8_4_;
        fVar189 = auVar114._12_4_;
        fVar190 = auVar114._16_4_;
        fVar180 = auVar114._20_4_;
        fVar84 = auVar114._24_4_;
        auVar98._4_4_ = fVar181 * fVar181 * fVar181 * auVar94._4_4_ * -0.5;
        auVar98._0_4_ = fVar174 * fVar174 * fVar174 * auVar94._0_4_ * -0.5;
        auVar98._8_4_ = fVar188 * fVar188 * fVar188 * auVar94._8_4_ * -0.5;
        auVar98._12_4_ = fVar189 * fVar189 * fVar189 * auVar94._12_4_ * -0.5;
        auVar98._16_4_ = fVar190 * fVar190 * fVar190 * -0.0;
        auVar98._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
        auVar98._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
        auVar98._28_4_ = 0;
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar114);
        auVar108._4_4_ = auVar117._4_4_ * auVar97._4_4_;
        auVar108._0_4_ = auVar117._0_4_ * auVar97._0_4_;
        auVar108._8_4_ = auVar117._8_4_ * auVar97._8_4_;
        auVar108._12_4_ = auVar117._12_4_ * auVar97._12_4_;
        auVar108._16_4_ = auVar117._16_4_ * auVar97._16_4_;
        auVar108._20_4_ = auVar117._20_4_ * auVar97._20_4_;
        auVar108._24_4_ = auVar117._24_4_ * auVar97._24_4_;
        auVar108._28_4_ = auVar114._28_4_;
        auVar99._4_4_ = -auVar116._4_4_ * auVar97._4_4_;
        auVar99._0_4_ = -auVar116._0_4_ * auVar97._0_4_;
        auVar99._8_4_ = -auVar116._8_4_ * auVar97._8_4_;
        auVar99._12_4_ = -auVar116._12_4_ * auVar97._12_4_;
        auVar99._16_4_ = -auVar116._16_4_ * auVar97._16_4_;
        auVar99._20_4_ = -auVar116._20_4_ * auVar97._20_4_;
        auVar99._24_4_ = -auVar116._24_4_ * auVar97._24_4_;
        auVar99._28_4_ = auVar116._28_4_ ^ 0x80000000;
        auVar114 = vmulps_avx512vl(auVar97,auVar103);
        auVar94 = vfmadd213ps_fma(auVar110,auVar105,auVar100);
        auVar93 = vfmadd213ps_fma(auVar109,auVar105,auVar101);
        auVar97 = vfmadd213ps_avx512vl(auVar112,auVar105,auVar111);
        auVar98 = vfmadd213ps_avx512vl(auVar108,ZEXT1632(auVar89),ZEXT1632(auVar22));
        auVar86 = vfnmadd213ps_fma(auVar110,auVar105,auVar100);
        auVar100 = ZEXT1632(auVar89);
        auVar87 = vfmadd213ps_fma(auVar99,auVar100,ZEXT1632(auVar23));
        auVar95 = vfnmadd213ps_fma(auVar109,auVar105,auVar101);
        auVar20 = vfmadd213ps_fma(auVar114,auVar100,auVar107);
        auVar110 = vfnmadd231ps_avx512vl(auVar111,auVar105,auVar112);
        auVar22 = vfnmadd213ps_fma(auVar108,auVar100,ZEXT1632(auVar22));
        auVar23 = vfnmadd213ps_fma(auVar99,auVar100,ZEXT1632(auVar23));
        auVar30 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar89),auVar114);
        auVar114 = vsubps_avx512vl(auVar98,ZEXT1632(auVar86));
        auVar112 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar95));
        auVar109 = vsubps_avx512vl(ZEXT1632(auVar20),auVar110);
        auVar108 = vmulps_avx512vl(auVar112,auVar110);
        auVar21 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar95),auVar109);
        auVar100._4_4_ = auVar86._4_4_ * auVar109._4_4_;
        auVar100._0_4_ = auVar86._0_4_ * auVar109._0_4_;
        auVar100._8_4_ = auVar86._8_4_ * auVar109._8_4_;
        auVar100._12_4_ = auVar86._12_4_ * auVar109._12_4_;
        auVar100._16_4_ = auVar109._16_4_ * 0.0;
        auVar100._20_4_ = auVar109._20_4_ * 0.0;
        auVar100._24_4_ = auVar109._24_4_ * 0.0;
        auVar100._28_4_ = auVar109._28_4_;
        auVar109 = vfmsub231ps_avx512vl(auVar100,auVar110,auVar114);
        auVar101._4_4_ = auVar95._4_4_ * auVar114._4_4_;
        auVar101._0_4_ = auVar95._0_4_ * auVar114._0_4_;
        auVar101._8_4_ = auVar95._8_4_ * auVar114._8_4_;
        auVar101._12_4_ = auVar95._12_4_ * auVar114._12_4_;
        auVar101._16_4_ = auVar114._16_4_ * 0.0;
        auVar101._20_4_ = auVar114._20_4_ * 0.0;
        auVar101._24_4_ = auVar114._24_4_ * 0.0;
        auVar101._28_4_ = auVar114._28_4_;
        auVar88 = vfmsub231ps_fma(auVar101,ZEXT1632(auVar86),auVar112);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar103,auVar109);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,ZEXT1632(auVar21));
        auVar113 = ZEXT1632(auVar96);
        uVar74 = vcmpps_avx512vl(auVar112,auVar113,2);
        bVar73 = (byte)uVar74;
        fVar84 = (float)((uint)(bVar73 & 1) * auVar94._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar22._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        fVar136 = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar22._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        fVar138 = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar22._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        fVar141 = (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar22._12_4_);
        auVar108 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar138,CONCAT44(fVar136,fVar84))));
        fVar85 = (float)((uint)(bVar73 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar23._0_4_);
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        fVar137 = (float)((uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar23._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        fVar139 = (float)((uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar23._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        fVar142 = (float)((uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar23._12_4_);
        auVar99 = ZEXT1632(CONCAT412(fVar142,CONCAT48(fVar139,CONCAT44(fVar137,fVar85))));
        auVar111._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar30._0_4_)
        ;
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar30._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar30._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar30._12_4_);
        fVar181 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar97._16_4_);
        auVar111._16_4_ = fVar181;
        fVar174 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar97._20_4_);
        auVar111._20_4_ = fVar174;
        fVar188 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar97._24_4_);
        auVar111._24_4_ = fVar188;
        iVar1 = (uint)(byte)(uVar74 >> 7) * auVar97._28_4_;
        auVar111._28_4_ = iVar1;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar98);
        auVar118._0_4_ =
             (uint)(bVar73 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar21._0_4_;
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar21._4_4_;
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar21._8_4_;
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar21._12_4_;
        auVar118._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar114._16_4_;
        auVar118._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar114._20_4_;
        auVar118._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar114._24_4_;
        auVar118._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar87));
        auVar119._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar93._0_4_
                    );
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar93._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar93._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar93._12_4_);
        fVar180 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar114._16_4_);
        auVar119._16_4_ = fVar180;
        fVar190 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar114._20_4_);
        auVar119._20_4_ = fVar190;
        fVar189 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar114._24_4_);
        auVar119._24_4_ = fVar189;
        auVar119._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar114._28_4_;
        auVar114 = vblendmps_avx512vl(auVar110,ZEXT1632(auVar20));
        auVar120._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar97._0_4_
                    );
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar97._4_4_);
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar97._8_4_);
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar97._12_4_);
        bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar13 * auVar114._16_4_ | (uint)!bVar13 * auVar97._16_4_);
        bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar13 * auVar114._20_4_ | (uint)!bVar13 * auVar97._20_4_);
        bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar13 * auVar114._24_4_ | (uint)!bVar13 * auVar97._24_4_);
        bVar13 = SUB81(uVar74 >> 7,0);
        auVar120._28_4_ = (uint)bVar13 * auVar114._28_4_ | (uint)!bVar13 * auVar97._28_4_;
        auVar121._0_4_ =
             (uint)(bVar73 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar98._0_4_;
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar13 * (int)auVar86._4_4_ | (uint)!bVar13 * auVar98._4_4_;
        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar13 * (int)auVar86._8_4_ | (uint)!bVar13 * auVar98._8_4_;
        bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar13 * (int)auVar86._12_4_ | (uint)!bVar13 * auVar98._12_4_;
        auVar121._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar98._16_4_;
        auVar121._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar98._20_4_;
        auVar121._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar98._24_4_;
        auVar121._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar98._28_4_;
        bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar122._0_4_ =
             (uint)(bVar73 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar20._0_4_;
        bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar14 * auVar110._4_4_ | (uint)!bVar14 * auVar20._4_4_;
        bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar14 * auVar110._8_4_ | (uint)!bVar14 * auVar20._8_4_;
        bVar14 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar14 * auVar110._12_4_ | (uint)!bVar14 * auVar20._12_4_;
        auVar122._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar110._16_4_;
        auVar122._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar110._20_4_;
        auVar122._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar110._24_4_;
        iVar2 = (uint)(byte)(uVar74 >> 7) * auVar110._28_4_;
        auVar122._28_4_ = iVar2;
        auVar100 = vsubps_avx512vl(auVar121,auVar108);
        auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar95._12_4_ |
                                                 (uint)!bVar16 * auVar87._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar95._8_4_ |
                                                          (uint)!bVar15 * auVar87._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar95._4_4_
                                                                   | (uint)!bVar13 * auVar87._4_4_,
                                                                   (uint)(bVar73 & 1) *
                                                                   (int)auVar95._0_4_ |
                                                                   (uint)!(bool)(bVar73 & 1) *
                                                                   auVar87._0_4_)))),auVar99);
        auVar110 = vsubps_avx(auVar122,auVar111);
        auVar109 = vsubps_avx(auVar108,auVar118);
        auVar97 = vsubps_avx(auVar99,auVar119);
        auVar98 = vsubps_avx(auVar111,auVar120);
        auVar103._4_4_ = auVar110._4_4_ * fVar136;
        auVar103._0_4_ = auVar110._0_4_ * fVar84;
        auVar103._8_4_ = auVar110._8_4_ * fVar138;
        auVar103._12_4_ = auVar110._12_4_ * fVar141;
        auVar103._16_4_ = auVar110._16_4_ * 0.0;
        auVar103._20_4_ = auVar110._20_4_ * 0.0;
        auVar103._24_4_ = auVar110._24_4_ * 0.0;
        auVar103._28_4_ = iVar2;
        auVar94 = vfmsub231ps_fma(auVar103,auVar111,auVar100);
        auVar104._4_4_ = fVar137 * auVar100._4_4_;
        auVar104._0_4_ = fVar85 * auVar100._0_4_;
        auVar104._8_4_ = fVar139 * auVar100._8_4_;
        auVar104._12_4_ = fVar142 * auVar100._12_4_;
        auVar104._16_4_ = auVar100._16_4_ * 0.0;
        auVar104._20_4_ = auVar100._20_4_ * 0.0;
        auVar104._24_4_ = auVar100._24_4_ * 0.0;
        auVar104._28_4_ = auVar112._28_4_;
        auVar93 = vfmsub231ps_fma(auVar104,auVar108,auVar114);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar113,ZEXT1632(auVar94));
        auVar184._0_4_ = auVar114._0_4_ * auVar111._0_4_;
        auVar184._4_4_ = auVar114._4_4_ * auVar111._4_4_;
        auVar184._8_4_ = auVar114._8_4_ * auVar111._8_4_;
        auVar184._12_4_ = auVar114._12_4_ * auVar111._12_4_;
        auVar184._16_4_ = auVar114._16_4_ * fVar181;
        auVar184._20_4_ = auVar114._20_4_ * fVar174;
        auVar184._24_4_ = auVar114._24_4_ * fVar188;
        auVar184._28_4_ = 0;
        auVar94 = vfmsub231ps_fma(auVar184,auVar99,auVar110);
        auVar101 = vfmadd231ps_avx512vl(auVar112,auVar113,ZEXT1632(auVar94));
        auVar112 = vmulps_avx512vl(auVar98,auVar118);
        auVar112 = vfmsub231ps_avx512vl(auVar112,auVar109,auVar120);
        auVar107._4_4_ = auVar97._4_4_ * auVar120._4_4_;
        auVar107._0_4_ = auVar97._0_4_ * auVar120._0_4_;
        auVar107._8_4_ = auVar97._8_4_ * auVar120._8_4_;
        auVar107._12_4_ = auVar97._12_4_ * auVar120._12_4_;
        auVar107._16_4_ = auVar97._16_4_ * auVar120._16_4_;
        auVar107._20_4_ = auVar97._20_4_ * auVar120._20_4_;
        auVar107._24_4_ = auVar97._24_4_ * auVar120._24_4_;
        auVar107._28_4_ = auVar120._28_4_;
        auVar94 = vfmsub231ps_fma(auVar107,auVar119,auVar98);
        auVar185._0_4_ = auVar119._0_4_ * auVar109._0_4_;
        auVar185._4_4_ = auVar119._4_4_ * auVar109._4_4_;
        auVar185._8_4_ = auVar119._8_4_ * auVar109._8_4_;
        auVar185._12_4_ = auVar119._12_4_ * auVar109._12_4_;
        auVar185._16_4_ = fVar180 * auVar109._16_4_;
        auVar185._20_4_ = fVar190 * auVar109._20_4_;
        auVar185._24_4_ = fVar189 * auVar109._24_4_;
        auVar185._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar185,auVar97,auVar118);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar93),auVar113,auVar112);
        auVar103 = vfmadd231ps_avx512vl(auVar112,auVar113,ZEXT1632(auVar94));
        auVar112 = vmaxps_avx(auVar101,auVar103);
        uVar146 = vcmpps_avx512vl(auVar112,auVar113,2);
        bVar83 = bVar83 & (byte)uVar146;
        auVar222 = ZEXT3264(local_340);
        auVar223 = ZEXT3264(local_3e0);
        auVar224 = ZEXT3264(local_360);
        auVar225 = ZEXT3264(local_400);
        auVar226 = ZEXT3264(local_420);
        auVar227 = ZEXT3264(local_380);
        auVar215 = ZEXT1664(_local_560);
        if (bVar83 == 0) {
          bVar83 = 0;
        }
        else {
          auVar41._4_4_ = auVar98._4_4_ * auVar114._4_4_;
          auVar41._0_4_ = auVar98._0_4_ * auVar114._0_4_;
          auVar41._8_4_ = auVar98._8_4_ * auVar114._8_4_;
          auVar41._12_4_ = auVar98._12_4_ * auVar114._12_4_;
          auVar41._16_4_ = auVar98._16_4_ * auVar114._16_4_;
          auVar41._20_4_ = auVar98._20_4_ * auVar114._20_4_;
          auVar41._24_4_ = auVar98._24_4_ * auVar114._24_4_;
          auVar41._28_4_ = auVar112._28_4_;
          auVar87 = vfmsub231ps_fma(auVar41,auVar97,auVar110);
          auVar42._4_4_ = auVar110._4_4_ * auVar109._4_4_;
          auVar42._0_4_ = auVar110._0_4_ * auVar109._0_4_;
          auVar42._8_4_ = auVar110._8_4_ * auVar109._8_4_;
          auVar42._12_4_ = auVar110._12_4_ * auVar109._12_4_;
          auVar42._16_4_ = auVar110._16_4_ * auVar109._16_4_;
          auVar42._20_4_ = auVar110._20_4_ * auVar109._20_4_;
          auVar42._24_4_ = auVar110._24_4_ * auVar109._24_4_;
          auVar42._28_4_ = auVar110._28_4_;
          auVar93 = vfmsub231ps_fma(auVar42,auVar100,auVar98);
          auVar43._4_4_ = auVar97._4_4_ * auVar100._4_4_;
          auVar43._0_4_ = auVar97._0_4_ * auVar100._0_4_;
          auVar43._8_4_ = auVar97._8_4_ * auVar100._8_4_;
          auVar43._12_4_ = auVar97._12_4_ * auVar100._12_4_;
          auVar43._16_4_ = auVar97._16_4_ * auVar100._16_4_;
          auVar43._20_4_ = auVar97._20_4_ * auVar100._20_4_;
          auVar43._24_4_ = auVar97._24_4_ * auVar100._24_4_;
          auVar43._28_4_ = auVar97._28_4_;
          auVar20 = vfmsub231ps_fma(auVar43,auVar109,auVar114);
          auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar93),ZEXT1632(auVar20));
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar87),auVar113);
          auVar114 = vrcp14ps_avx512vl(auVar112);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = &DAT_3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar110 = vfnmadd213ps_avx512vl(auVar114,auVar112,auVar32);
          auVar94 = vfmadd132ps_fma(auVar110,auVar114,auVar114);
          auVar44._4_4_ = auVar20._4_4_ * auVar111._4_4_;
          auVar44._0_4_ = auVar20._0_4_ * auVar111._0_4_;
          auVar44._8_4_ = auVar20._8_4_ * auVar111._8_4_;
          auVar44._12_4_ = auVar20._12_4_ * auVar111._12_4_;
          auVar44._16_4_ = fVar181 * 0.0;
          auVar44._20_4_ = fVar174 * 0.0;
          auVar44._24_4_ = fVar188 * 0.0;
          auVar44._28_4_ = iVar1;
          auVar93 = vfmadd231ps_fma(auVar44,auVar99,ZEXT1632(auVar93));
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar108,ZEXT1632(auVar87));
          fVar181 = auVar94._0_4_;
          fVar188 = auVar94._4_4_;
          fVar189 = auVar94._8_4_;
          fVar190 = auVar94._12_4_;
          auVar114 = ZEXT1632(CONCAT412(auVar93._12_4_ * fVar190,
                                        CONCAT48(auVar93._8_4_ * fVar189,
                                                 CONCAT44(auVar93._4_4_ * fVar188,
                                                          auVar93._0_4_ * fVar181))));
          auVar203._4_4_ = uVar145;
          auVar203._0_4_ = uVar145;
          auVar203._8_4_ = uVar145;
          auVar203._12_4_ = uVar145;
          auVar203._16_4_ = uVar145;
          auVar203._20_4_ = uVar145;
          auVar203._24_4_ = uVar145;
          auVar203._28_4_ = uVar145;
          uVar146 = vcmpps_avx512vl(auVar203,auVar114,2);
          fVar174 = (ray->super_RayK<1>).tfar;
          auVar33._4_4_ = fVar174;
          auVar33._0_4_ = fVar174;
          auVar33._8_4_ = fVar174;
          auVar33._12_4_ = fVar174;
          auVar33._16_4_ = fVar174;
          auVar33._20_4_ = fVar174;
          auVar33._24_4_ = fVar174;
          auVar33._28_4_ = fVar174;
          uVar26 = vcmpps_avx512vl(auVar114,auVar33,2);
          bVar83 = (byte)uVar146 & (byte)uVar26 & bVar83;
          if (bVar83 != 0) {
            uVar146 = vcmpps_avx512vl(auVar112,auVar113,4);
            if ((bVar83 & (byte)uVar146) != 0) {
              bVar83 = bVar83 & (byte)uVar146;
              fVar174 = auVar101._0_4_ * fVar181;
              fVar180 = auVar101._4_4_ * fVar188;
              auVar45._4_4_ = fVar180;
              auVar45._0_4_ = fVar174;
              fVar84 = auVar101._8_4_ * fVar189;
              auVar45._8_4_ = fVar84;
              fVar85 = auVar101._12_4_ * fVar190;
              auVar45._12_4_ = fVar85;
              fVar136 = auVar101._16_4_ * 0.0;
              auVar45._16_4_ = fVar136;
              fVar137 = auVar101._20_4_ * 0.0;
              auVar45._20_4_ = fVar137;
              fVar138 = auVar101._24_4_ * 0.0;
              auVar45._24_4_ = fVar138;
              auVar45._28_4_ = auVar101._28_4_;
              fVar181 = auVar103._0_4_ * fVar181;
              fVar188 = auVar103._4_4_ * fVar188;
              auVar46._4_4_ = fVar188;
              auVar46._0_4_ = fVar181;
              fVar189 = auVar103._8_4_ * fVar189;
              auVar46._8_4_ = fVar189;
              fVar190 = auVar103._12_4_ * fVar190;
              auVar46._12_4_ = fVar190;
              fVar139 = auVar103._16_4_ * 0.0;
              auVar46._16_4_ = fVar139;
              fVar141 = auVar103._20_4_ * 0.0;
              auVar46._20_4_ = fVar141;
              fVar142 = auVar103._24_4_ * 0.0;
              auVar46._24_4_ = fVar142;
              auVar46._28_4_ = auVar103._28_4_;
              auVar197._8_4_ = 0x3f800000;
              auVar197._0_8_ = &DAT_3f8000003f800000;
              auVar197._12_4_ = 0x3f800000;
              auVar197._16_4_ = 0x3f800000;
              auVar197._20_4_ = 0x3f800000;
              auVar197._24_4_ = 0x3f800000;
              auVar197._28_4_ = 0x3f800000;
              auVar112 = vsubps_avx(auVar197,auVar45);
              local_440._0_4_ =
                   (uint)(bVar73 & 1) * (int)fVar174 | (uint)!(bool)(bVar73 & 1) * auVar112._0_4_;
              bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
              local_440._4_4_ = (uint)bVar13 * (int)fVar180 | (uint)!bVar13 * auVar112._4_4_;
              bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
              local_440._8_4_ = (uint)bVar13 * (int)fVar84 | (uint)!bVar13 * auVar112._8_4_;
              bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
              local_440._12_4_ = (uint)bVar13 * (int)fVar85 | (uint)!bVar13 * auVar112._12_4_;
              bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
              local_440._16_4_ = (uint)bVar13 * (int)fVar136 | (uint)!bVar13 * auVar112._16_4_;
              bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
              local_440._20_4_ = (uint)bVar13 * (int)fVar137 | (uint)!bVar13 * auVar112._20_4_;
              bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
              local_440._24_4_ = (uint)bVar13 * (int)fVar138 | (uint)!bVar13 * auVar112._24_4_;
              bVar13 = SUB81(uVar74 >> 7,0);
              local_440._28_4_ = (uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar112._28_4_;
              auVar112 = vsubps_avx(auVar197,auVar46);
              bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar74 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar74 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar74 >> 6) & 1);
              bVar19 = SUB81(uVar74 >> 7,0);
              local_1a0._4_4_ = (uint)bVar13 * (int)fVar188 | (uint)!bVar13 * auVar112._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar73 & 1) * (int)fVar181 | (uint)!(bool)(bVar73 & 1) * auVar112._0_4_;
              local_1a0._8_4_ = (uint)bVar14 * (int)fVar189 | (uint)!bVar14 * auVar112._8_4_;
              local_1a0._12_4_ = (uint)bVar15 * (int)fVar190 | (uint)!bVar15 * auVar112._12_4_;
              local_1a0._16_4_ = (uint)bVar16 * (int)fVar139 | (uint)!bVar16 * auVar112._16_4_;
              local_1a0._20_4_ = (uint)bVar17 * (int)fVar141 | (uint)!bVar17 * auVar112._20_4_;
              local_1a0._24_4_ = (uint)bVar18 * (int)fVar142 | (uint)!bVar18 * auVar112._24_4_;
              local_1a0._28_4_ = (uint)bVar19 * auVar103._28_4_ | (uint)!bVar19 * auVar112._28_4_;
              local_4e0 = auVar114;
              goto LAB_01c7dc53;
            }
          }
          bVar83 = 0;
        }
LAB_01c7dc53:
        auVar219 = ZEXT3264(auVar102);
        local_5b0 = auVar24;
        _local_530 = auVar29;
        if (bVar83 != 0) {
          auVar112 = vsubps_avx(ZEXT1632(auVar89),auVar105);
          auVar94 = vfmadd213ps_fma(auVar112,local_440,auVar105);
          fVar174 = local_5e8->depth_scale;
          auVar105._4_4_ = fVar174;
          auVar105._0_4_ = fVar174;
          auVar105._8_4_ = fVar174;
          auVar105._12_4_ = fVar174;
          auVar105._16_4_ = fVar174;
          auVar105._20_4_ = fVar174;
          auVar105._24_4_ = fVar174;
          auVar105._28_4_ = fVar174;
          auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                        CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                 CONCAT44(auVar94._4_4_ +
                                                                          auVar94._4_4_,
                                                                          auVar94._0_4_ +
                                                                          auVar94._0_4_)))),auVar105
                                    );
          uVar146 = vcmpps_avx512vl(local_4e0,auVar112,6);
          bVar83 = bVar83 & (byte)uVar146;
          if (bVar83 != 0) {
            auVar150._8_4_ = 0xbf800000;
            auVar150._0_8_ = 0xbf800000bf800000;
            auVar150._12_4_ = 0xbf800000;
            auVar150._16_4_ = 0xbf800000;
            auVar150._20_4_ = 0xbf800000;
            auVar150._24_4_ = 0xbf800000;
            auVar150._28_4_ = 0xbf800000;
            auVar34._8_4_ = 0x40000000;
            auVar34._0_8_ = 0x4000000040000000;
            auVar34._12_4_ = 0x40000000;
            auVar34._16_4_ = 0x40000000;
            auVar34._20_4_ = 0x40000000;
            auVar34._24_4_ = 0x40000000;
            auVar34._28_4_ = 0x40000000;
            local_1a0 = vfmadd132ps_avx512vl(local_1a0,auVar150,auVar34);
            local_2e0 = local_440;
            auVar112 = local_1a0;
            local_2c0 = local_1a0;
            local_2a0 = local_4e0;
            local_280 = 0;
            local_27c = iVar8;
            local_270 = local_5b0._0_8_;
            uStack_268 = local_5b0._8_8_;
            local_260 = local_540._0_8_;
            uStack_258 = local_540._8_8_;
            local_250 = local_550._0_8_;
            uStack_248 = local_550._8_8_;
            local_240 = local_530;
            uStack_238 = uStack_528;
            local_230 = bVar83;
            local_1a0 = auVar112;
            if ((pGVar79->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar174 = 1.0 / auVar106._0_4_;
              local_220[0] = fVar174 * (local_440._0_4_ + 0.0);
              local_220[1] = fVar174 * (local_440._4_4_ + 1.0);
              local_220[2] = fVar174 * (local_440._8_4_ + 2.0);
              local_220[3] = fVar174 * (local_440._12_4_ + 3.0);
              fStack_210 = fVar174 * (local_440._16_4_ + 4.0);
              fStack_20c = fVar174 * (local_440._20_4_ + 5.0);
              fStack_208 = fVar174 * (local_440._24_4_ + 6.0);
              fStack_204 = local_440._28_4_ + 7.0;
              local_200 = local_1a0._0_8_;
              uStack_1f8 = local_1a0._8_8_;
              uStack_1f0 = local_1a0._16_8_;
              uStack_1e8 = local_1a0._24_8_;
              local_1e0 = local_4e0;
              auVar151._8_4_ = 0x7f800000;
              auVar151._0_8_ = 0x7f8000007f800000;
              auVar151._12_4_ = 0x7f800000;
              auVar151._16_4_ = 0x7f800000;
              auVar151._20_4_ = 0x7f800000;
              auVar151._24_4_ = 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar114 = vblendmps_avx512vl(auVar151,local_4e0);
              auVar123._0_4_ =
                   (uint)(bVar83 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar83 >> 1 & 1);
              auVar123._4_4_ = (uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar83 >> 2 & 1);
              auVar123._8_4_ = (uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar83 >> 3 & 1);
              auVar123._12_4_ = (uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar83 >> 4 & 1);
              auVar123._16_4_ = (uint)bVar13 * auVar114._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar83 >> 5 & 1);
              auVar123._20_4_ = (uint)bVar13 * auVar114._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar83 >> 6 & 1);
              auVar123._24_4_ = (uint)bVar13 * auVar114._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar123._28_4_ =
                   (uint)(bVar83 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar83 >> 7) * 0x7f800000;
              auVar114 = vshufps_avx(auVar123,auVar123,0xb1);
              auVar114 = vminps_avx(auVar123,auVar114);
              auVar110 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar110);
              auVar110 = vpermpd_avx2(auVar114,0x4e);
              auVar114 = vminps_avx(auVar114,auVar110);
              uVar146 = vcmpps_avx512vl(auVar123,auVar114,0);
              bVar72 = (byte)uVar146 & bVar83;
              bVar73 = bVar83;
              if (bVar72 != 0) {
                bVar73 = bVar72;
              }
              uVar76 = 0;
              for (uVar75 = (uint)bVar73; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
                uVar76 = uVar76 + 1;
              }
              uVar74 = (ulong)uVar76;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar79->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar174 = local_220[uVar74];
                fVar181 = *(float *)((long)&local_200 + uVar74 * 4);
                fVar189 = 1.0 - fVar174;
                fVar188 = fVar189 * fVar189 * -3.0;
                auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar189 * fVar189)),
                                          ZEXT416((uint)(fVar174 * fVar189)),ZEXT416(0xc0000000));
                auVar93 = vfmsub132ss_fma(ZEXT416((uint)(fVar174 * fVar189)),
                                          ZEXT416((uint)(fVar174 * fVar174)),ZEXT416(0x40000000));
                fVar189 = auVar94._0_4_ * 3.0;
                fVar190 = auVar93._0_4_ * 3.0;
                fVar180 = fVar174 * fVar174 * 3.0;
                auVar193._0_4_ = fVar180 * (float)local_530._0_4_;
                auVar193._4_4_ = fVar180 * (float)local_530._4_4_;
                auVar193._8_4_ = fVar180 * (float)uStack_528;
                auVar193._12_4_ = fVar180 * uStack_528._4_4_;
                auVar166._4_4_ = fVar190;
                auVar166._0_4_ = fVar190;
                auVar166._8_4_ = fVar190;
                auVar166._12_4_ = fVar190;
                auVar94 = vfmadd132ps_fma(auVar166,auVar193,local_550);
                auVar175._4_4_ = fVar189;
                auVar175._0_4_ = fVar189;
                auVar175._8_4_ = fVar189;
                auVar175._12_4_ = fVar189;
                auVar94 = vfmadd132ps_fma(auVar175,auVar94,local_540);
                auVar167._4_4_ = fVar188;
                auVar167._0_4_ = fVar188;
                auVar167._8_4_ = fVar188;
                auVar167._12_4_ = fVar188;
                (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar74 * 4);
                auVar94 = vfmadd132ps_fma(auVar167,auVar94,local_5b0);
                uVar146 = vmovlps_avx(auVar94);
                *(undefined8 *)&(ray->Ng).field_0 = uVar146;
                fVar188 = (float)vextractps_avx(auVar94,2);
                (ray->Ng).field_0.field_0.z = fVar188;
                ray->u = fVar174;
                ray->v = fVar181;
                ray->primID = uVar77;
                ray->geomID = uVar81;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_490 = local_540._0_4_;
                uStack_48c = local_540._4_4_;
                uStack_488 = local_540._8_8_;
                local_4a0 = local_550._0_8_;
                uStack_498 = local_550._8_8_;
                local_600 = prim;
                local_550 = auVar25;
                local_540 = auVar28;
                local_4b0 = (float)local_530._0_4_;
                fStack_4ac = (float)local_530._4_4_;
                fStack_4a8 = (float)uStack_528;
                fStack_4a4 = uStack_528._4_4_;
                do {
                  _local_530 = auVar29;
                  auVar87 = auVar221._0_16_;
                  local_594 = local_220[uVar74];
                  local_590 = *(undefined4 *)((long)&local_200 + uVar74 * 4);
                  fVar174 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar74 * 4);
                  local_5e0.context = context->user;
                  fVar188 = 1.0 - local_594;
                  fVar181 = fVar188 * fVar188 * -3.0;
                  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar188 * fVar188)),
                                            ZEXT416((uint)(local_594 * fVar188)),ZEXT416(0xc0000000)
                                           );
                  auVar93 = vfmsub132ss_fma(ZEXT416((uint)(local_594 * fVar188)),
                                            ZEXT416((uint)(local_594 * local_594)),
                                            ZEXT416(0x40000000));
                  fVar188 = auVar94._0_4_ * 3.0;
                  fVar189 = auVar93._0_4_ * 3.0;
                  fVar190 = local_594 * local_594 * 3.0;
                  auVar196._0_4_ = fVar190 * local_4b0;
                  auVar196._4_4_ = fVar190 * fStack_4ac;
                  auVar196._8_4_ = fVar190 * fStack_4a8;
                  auVar196._12_4_ = fVar190 * fStack_4a4;
                  auVar172._4_4_ = fVar189;
                  auVar172._0_4_ = fVar189;
                  auVar172._8_4_ = fVar189;
                  auVar172._12_4_ = fVar189;
                  auVar68._8_8_ = uStack_498;
                  auVar68._0_8_ = local_4a0;
                  auVar94 = vfmadd132ps_fma(auVar172,auVar196,auVar68);
                  auVar178._4_4_ = fVar188;
                  auVar178._0_4_ = fVar188;
                  auVar178._8_4_ = fVar188;
                  auVar178._12_4_ = fVar188;
                  auVar69._4_4_ = uStack_48c;
                  auVar69._0_4_ = local_490;
                  auVar69._8_8_ = uStack_488;
                  auVar94 = vfmadd132ps_fma(auVar178,auVar94,auVar69);
                  auVar173._4_4_ = fVar181;
                  auVar173._0_4_ = fVar181;
                  auVar173._8_4_ = fVar181;
                  auVar173._12_4_ = fVar181;
                  auVar94 = vfmadd132ps_fma(auVar173,auVar94,local_5b0);
                  local_5a0 = vmovlps_avx(auVar94);
                  local_598 = vextractps_avx(auVar94,2);
                  local_58c = (int)local_5f0;
                  local_588 = (int)local_5f8;
                  local_584 = (local_5e0.context)->instID[0];
                  local_580 = (local_5e0.context)->instPrimID[0];
                  local_604 = -1;
                  local_5e0.valid = &local_604;
                  local_5e0.geometryUserPtr = pGVar79->userPtr;
                  local_5e0.ray = (RTCRayN *)ray;
                  local_5e0.hit = (RTCHitN *)&local_5a0;
                  local_5e0.N = 1;
                  local_320 = (undefined4)uVar74;
                  uStack_31c = (undefined4)(uVar74 >> 0x20);
                  if (pGVar79->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c7ef56:
                    auVar94 = auVar221._0_16_;
                    p_Var12 = context->args->filter;
                    if (p_Var12 != (RTCFilterFunctionN)0x0) {
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar79->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var12)(&local_5e0);
                        uVar74 = CONCAT44(uStack_31c,local_320);
                        auVar215 = ZEXT1664(_local_560);
                        auVar219 = ZEXT3264(local_460);
                        auVar228 = ZEXT3264(local_3a0);
                        auVar227 = ZEXT3264(local_380);
                        auVar226 = ZEXT3264(local_420);
                        auVar225 = ZEXT3264(local_400);
                        auVar224 = ZEXT3264(local_360);
                        auVar223 = ZEXT3264(local_3e0);
                        auVar222 = ZEXT3264(local_340);
                        auVar220 = ZEXT3264(local_3c0);
                        auVar94 = vxorps_avx512vl(auVar94,auVar94);
                        auVar221 = ZEXT1664(auVar94);
                        prim = local_600;
                        uVar145 = local_480;
                      }
                      if (*local_5e0.valid == 0) goto LAB_01c7f05f;
                    }
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_5e0.hit;
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_5e0.hit + 4);
                    (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_5e0.hit + 8);
                    *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
                    *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
                    *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
                    *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
                    *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
                    *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
                  }
                  else {
                    (*pGVar79->intersectionFilterN)(&local_5e0);
                    uVar74 = CONCAT44(uStack_31c,local_320);
                    auVar215 = ZEXT1664(_local_560);
                    auVar219 = ZEXT3264(local_460);
                    auVar228 = ZEXT3264(local_3a0);
                    auVar227 = ZEXT3264(local_380);
                    auVar226 = ZEXT3264(local_420);
                    auVar225 = ZEXT3264(local_400);
                    auVar224 = ZEXT3264(local_360);
                    auVar223 = ZEXT3264(local_3e0);
                    auVar222 = ZEXT3264(local_340);
                    auVar220 = ZEXT3264(local_3c0);
                    auVar94 = vxorps_avx512vl(auVar87,auVar87);
                    auVar221 = ZEXT1664(auVar94);
                    prim = local_600;
                    uVar145 = local_480;
                    if (*local_5e0.valid != 0) goto LAB_01c7ef56;
LAB_01c7f05f:
                    (ray->super_RayK<1>).tfar = fVar174;
                  }
                  uVar213 = auVar215._0_4_;
                  auVar102 = auVar219._0_32_;
                  bVar73 = ~(byte)(1 << ((uint)uVar74 & 0x1f)) & bVar83;
                  fVar174 = (ray->super_RayK<1>).tfar;
                  auVar40._4_4_ = fVar174;
                  auVar40._0_4_ = fVar174;
                  auVar40._8_4_ = fVar174;
                  auVar40._12_4_ = fVar174;
                  auVar40._16_4_ = fVar174;
                  auVar40._20_4_ = fVar174;
                  auVar40._24_4_ = fVar174;
                  auVar40._28_4_ = fVar174;
                  uVar146 = vcmpps_avx512vl(local_4e0,auVar40,2);
                  bVar83 = bVar73 & (byte)uVar146;
                  if ((bVar73 & (byte)uVar146) != 0) {
                    auVar155._8_4_ = 0x7f800000;
                    auVar155._0_8_ = 0x7f8000007f800000;
                    auVar155._12_4_ = 0x7f800000;
                    auVar155._16_4_ = 0x7f800000;
                    auVar155._20_4_ = 0x7f800000;
                    auVar155._24_4_ = 0x7f800000;
                    auVar155._28_4_ = 0x7f800000;
                    auVar112 = vblendmps_avx512vl(auVar155,local_4e0);
                    auVar135._0_4_ =
                         (uint)(bVar83 & 1) * auVar112._0_4_ |
                         (uint)!(bool)(bVar83 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar83 >> 1 & 1);
                    auVar135._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar83 >> 2 & 1);
                    auVar135._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar83 >> 3 & 1);
                    auVar135._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar83 >> 4 & 1);
                    auVar135._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar83 >> 5 & 1);
                    auVar135._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar83 >> 6 & 1);
                    auVar135._24_4_ = (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar135._28_4_ =
                         (uint)(bVar83 >> 7) * auVar112._28_4_ |
                         (uint)!(bool)(bVar83 >> 7) * 0x7f800000;
                    auVar112 = vshufps_avx(auVar135,auVar135,0xb1);
                    auVar112 = vminps_avx(auVar135,auVar112);
                    auVar114 = vshufpd_avx(auVar112,auVar112,5);
                    auVar112 = vminps_avx(auVar112,auVar114);
                    auVar114 = vpermpd_avx2(auVar112,0x4e);
                    auVar112 = vminps_avx(auVar112,auVar114);
                    uVar146 = vcmpps_avx512vl(auVar135,auVar112,0);
                    bVar72 = (byte)uVar146 & bVar83;
                    bVar73 = bVar83;
                    if (bVar72 != 0) {
                      bVar73 = bVar72;
                    }
                    uVar81 = 0;
                    for (uVar77 = (uint)bVar73; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000
                        ) {
                      uVar81 = uVar81 + 1;
                    }
                    uVar74 = (ulong)uVar81;
                  }
                  auVar25 = local_550;
                  auVar28 = local_540;
                  auVar29 = _local_530;
                } while (bVar83 != 0);
              }
            }
          }
        }
      }
      local_540 = auVar28;
      local_550 = auVar25;
      if (8 < iVar8) {
        auVar112 = vpbroadcastd_avx512vl();
        auVar215 = ZEXT3264(auVar112);
        local_480 = uVar213;
        uStack_47c = uVar213;
        uStack_478 = uVar213;
        uStack_474 = uVar213;
        uStack_470 = uVar213;
        uStack_46c = uVar213;
        uStack_468 = uVar213;
        uStack_464 = uVar213;
        local_320 = uVar145;
        uStack_31c = uVar145;
        uStack_318 = uVar145;
        uStack_314 = uVar145;
        uStack_310 = uVar145;
        uStack_30c = uVar145;
        uStack_308 = uVar145;
        uStack_304 = uVar145;
        local_300._4_4_ = 1.0 / (float)local_300._0_4_;
        local_300._0_4_ = local_300._4_4_;
        fStack_2f8 = (float)local_300._4_4_;
        fStack_2f4 = (float)local_300._4_4_;
        fStack_2f0 = (float)local_300._4_4_;
        fStack_2ec = (float)local_300._4_4_;
        fStack_2e8 = (float)local_300._4_4_;
        fStack_2e4 = (float)local_300._4_4_;
        lVar80 = 8;
        local_460 = auVar102;
        do {
          auVar112 = vpbroadcastd_avx512vl();
          auVar97 = vpor_avx2(auVar112,_DAT_0205a920);
          uVar26 = vpcmpgtd_avx512vl(auVar215._0_32_,auVar97);
          auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 * 4 + lVar27);
          auVar114 = *(undefined1 (*) [32])(lVar27 + 0x2227768 + lVar80 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar27 + 0x2227bec + lVar80 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar27 + 0x2228070 + lVar80 * 4);
          local_380 = auVar227._0_32_;
          auVar98 = vmulps_avx512vl(local_380,auVar109);
          local_3a0 = auVar228._0_32_;
          auVar108 = vmulps_avx512vl(local_3a0,auVar109);
          auVar47._4_4_ = auVar109._4_4_ * (float)local_e0._4_4_;
          auVar47._0_4_ = auVar109._0_4_ * (float)local_e0._0_4_;
          auVar47._8_4_ = auVar109._8_4_ * fStack_d8;
          auVar47._12_4_ = auVar109._12_4_ * fStack_d4;
          auVar47._16_4_ = auVar109._16_4_ * fStack_d0;
          auVar47._20_4_ = auVar109._20_4_ * fStack_cc;
          auVar47._24_4_ = auVar109._24_4_ * fStack_c8;
          auVar47._28_4_ = auVar97._28_4_;
          auVar116 = auVar225._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar98,auVar110,auVar116);
          auVar117 = auVar226._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar117);
          auVar108 = vfmadd231ps_avx512vl(auVar47,auVar110,local_c0);
          auVar115 = auVar223._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar114,auVar115);
          local_360 = auVar224._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar114,local_360);
          auVar94 = vfmadd231ps_fma(auVar108,auVar114,local_a0);
          auVar113 = auVar220._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar97,auVar112,auVar113);
          local_340 = auVar222._0_32_;
          auVar103 = vfmadd231ps_avx512vl(auVar98,auVar112,local_340);
          auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 * 4 + lVar27);
          auVar98 = *(undefined1 (*) [32])(lVar27 + 0x2229b88 + lVar80 * 4);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar112,local_80);
          auVar108 = *(undefined1 (*) [32])(lVar27 + 0x222a00c + lVar80 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar27 + 0x222a490 + lVar80 * 4);
          auVar102 = vmulps_avx512vl(local_380,auVar99);
          auVar100 = vmulps_avx512vl(local_3a0,auVar99);
          auVar48._4_4_ = auVar99._4_4_ * (float)local_e0._4_4_;
          auVar48._0_4_ = auVar99._0_4_ * (float)local_e0._0_4_;
          auVar48._8_4_ = auVar99._8_4_ * fStack_d8;
          auVar48._12_4_ = auVar99._12_4_ * fStack_d4;
          auVar48._16_4_ = auVar99._16_4_ * fStack_d0;
          auVar48._20_4_ = auVar99._20_4_ * fStack_cc;
          auVar48._24_4_ = auVar99._24_4_ * fStack_c8;
          auVar48._28_4_ = uStack_c4;
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar116);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar117);
          auVar104 = vfmadd231ps_avx512vl(auVar48,auVar108,local_c0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar115);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_360);
          auVar93 = vfmadd231ps_fma(auVar104,auVar98,local_a0);
          auVar104 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar113);
          auVar105 = vfmadd231ps_avx512vl(auVar100,auVar97,local_340);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar97,local_80);
          auVar106 = vmaxps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar93));
          auVar102 = vsubps_avx(auVar104,auVar101);
          auVar100 = vsubps_avx(auVar105,auVar103);
          auVar107 = vmulps_avx512vl(auVar103,auVar102);
          auVar111 = vmulps_avx512vl(auVar101,auVar100);
          auVar107 = vsubps_avx512vl(auVar107,auVar111);
          auVar111 = vmulps_avx512vl(auVar100,auVar100);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar102,auVar102);
          auVar106 = vmulps_avx512vl(auVar106,auVar106);
          auVar106 = vmulps_avx512vl(auVar106,auVar111);
          auVar107 = vmulps_avx512vl(auVar107,auVar107);
          uVar146 = vcmpps_avx512vl(auVar107,auVar106,2);
          local_230 = (byte)uVar26 & (byte)uVar146;
          if (local_230 == 0) {
            auVar220 = ZEXT3264(auVar113);
          }
          else {
            auVar99 = vmulps_avx512vl(local_460,auVar99);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_140,auVar99);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_120,auVar108);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_100,auVar98);
            auVar109 = vmulps_avx512vl(local_460,auVar109);
            auVar110 = vfmadd213ps_avx512vl(auVar110,local_140,auVar109);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_120,auVar110);
            auVar98 = vfmadd213ps_avx512vl(auVar112,local_100,auVar114);
            auVar112 = *(undefined1 (*) [32])(lVar27 + 0x22284f4 + lVar80 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar27 + 0x2228978 + lVar80 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar27 + 0x2228dfc + lVar80 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar27 + 0x2229280 + lVar80 * 4);
            auVar108 = vmulps_avx512vl(local_380,auVar109);
            auVar99 = vmulps_avx512vl(local_3a0,auVar109);
            auVar109 = vmulps_avx512vl(local_460,auVar109);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar116);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar110,auVar117);
            auVar110 = vfmadd231ps_avx512vl(auVar109,local_140,auVar110);
            auVar109 = vfmadd231ps_avx512vl(auVar108,auVar114,auVar115);
            auVar108 = vfmadd231ps_avx512vl(auVar99,auVar114,local_360);
            auVar114 = vfmadd231ps_avx512vl(auVar110,local_120,auVar114);
            auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,auVar113);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar112,local_340);
            auVar99 = vfmadd231ps_avx512vl(auVar114,local_100,auVar112);
            auVar112 = *(undefined1 (*) [32])(lVar27 + 0x222a914 + lVar80 * 4);
            auVar114 = *(undefined1 (*) [32])(lVar27 + 0x222b21c + lVar80 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar27 + 0x222b6a0 + lVar80 * 4);
            auVar106 = vmulps_avx512vl(local_380,auVar110);
            auVar107 = vmulps_avx512vl(local_3a0,auVar110);
            auVar110 = vmulps_avx512vl(local_460,auVar110);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,auVar116);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,auVar117);
            auVar110 = vfmadd231ps_avx512vl(auVar110,local_140,auVar114);
            auVar114 = *(undefined1 (*) [32])(lVar27 + 0x222ad98 + lVar80 * 4);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar114,auVar115);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_360);
            auVar114 = vfmadd231ps_avx512vl(auVar110,local_120,auVar114);
            auVar110 = vfmadd231ps_avx512vl(auVar106,auVar112,auVar113);
            auVar106 = vfmadd231ps_avx512vl(auVar107,auVar112,local_340);
            auVar114 = vfmadd231ps_avx512vl(auVar114,local_100,auVar112);
            auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar109,auVar107);
            vandps_avx512vl(auVar108,auVar107);
            auVar112 = vmaxps_avx(auVar107,auVar107);
            vandps_avx512vl(auVar99,auVar107);
            auVar112 = vmaxps_avx(auVar112,auVar107);
            auVar70._4_4_ = uStack_47c;
            auVar70._0_4_ = local_480;
            auVar70._8_4_ = uStack_478;
            auVar70._12_4_ = uStack_474;
            auVar70._16_4_ = uStack_470;
            auVar70._20_4_ = uStack_46c;
            auVar70._24_4_ = uStack_468;
            auVar70._28_4_ = uStack_464;
            uVar74 = vcmpps_avx512vl(auVar112,auVar70,1);
            bVar13 = (bool)((byte)uVar74 & 1);
            auVar124._0_4_ = (float)((uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar109._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar109._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar109._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar109._12_4_);
            bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar109._16_4_);
            bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar109._20_4_);
            bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar109._24_4_);
            bVar13 = SUB81(uVar74 >> 7,0);
            auVar124._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar109._28_4_;
            bVar13 = (bool)((byte)uVar74 & 1);
            auVar125._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar108._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar108._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar108._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar108._12_4_);
            bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar125._16_4_ =
                 (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar108._16_4_);
            bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar125._20_4_ =
                 (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar108._20_4_);
            bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar125._24_4_ =
                 (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar108._24_4_);
            bVar13 = SUB81(uVar74 >> 7,0);
            auVar125._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar108._28_4_;
            vandps_avx512vl(auVar110,auVar107);
            vandps_avx512vl(auVar106,auVar107);
            auVar112 = vmaxps_avx(auVar125,auVar125);
            vandps_avx512vl(auVar114,auVar107);
            auVar112 = vmaxps_avx(auVar112,auVar125);
            uVar74 = vcmpps_avx512vl(auVar112,auVar70,1);
            bVar13 = (bool)((byte)uVar74 & 1);
            auVar126._0_4_ = (uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar110._0_4_;
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar126._4_4_ = (uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar110._4_4_;
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar126._8_4_ = (uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar110._8_4_;
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar126._12_4_ = (uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar110._12_4_;
            bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar126._16_4_ = (uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar110._16_4_;
            bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar126._20_4_ = (uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar110._20_4_;
            bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar126._24_4_ = (uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar110._24_4_;
            bVar13 = SUB81(uVar74 >> 7,0);
            auVar126._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar110._28_4_;
            bVar13 = (bool)((byte)uVar74 & 1);
            auVar127._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar106._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar106._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar106._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar106._12_4_);
            bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
            auVar127._16_4_ =
                 (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar106._16_4_);
            bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
            auVar127._20_4_ =
                 (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar106._20_4_);
            bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
            auVar127._24_4_ =
                 (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar106._24_4_);
            bVar13 = SUB81(uVar74 >> 7,0);
            auVar127._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar106._28_4_;
            auVar207._8_4_ = 0x80000000;
            auVar207._0_8_ = 0x8000000080000000;
            auVar207._12_4_ = 0x80000000;
            auVar207._16_4_ = 0x80000000;
            auVar207._20_4_ = 0x80000000;
            auVar207._24_4_ = 0x80000000;
            auVar207._28_4_ = 0x80000000;
            auVar112 = vxorps_avx512vl(auVar126,auVar207);
            auVar106 = auVar221._0_32_;
            auVar114 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar106);
            auVar87 = vfmadd231ps_fma(auVar114,auVar125,auVar125);
            auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
            auVar218._8_4_ = 0xbf000000;
            auVar218._0_8_ = 0xbf000000bf000000;
            auVar218._12_4_ = 0xbf000000;
            auVar218._16_4_ = 0xbf000000;
            auVar218._20_4_ = 0xbf000000;
            auVar218._24_4_ = 0xbf000000;
            auVar218._28_4_ = 0xbf000000;
            fVar174 = auVar114._0_4_;
            fVar181 = auVar114._4_4_;
            fVar188 = auVar114._8_4_;
            fVar189 = auVar114._12_4_;
            fVar190 = auVar114._16_4_;
            fVar180 = auVar114._20_4_;
            fVar84 = auVar114._24_4_;
            auVar49._4_4_ = fVar181 * fVar181 * fVar181 * auVar87._4_4_ * -0.5;
            auVar49._0_4_ = fVar174 * fVar174 * fVar174 * auVar87._0_4_ * -0.5;
            auVar49._8_4_ = fVar188 * fVar188 * fVar188 * auVar87._8_4_ * -0.5;
            auVar49._12_4_ = fVar189 * fVar189 * fVar189 * auVar87._12_4_ * -0.5;
            auVar49._16_4_ = fVar190 * fVar190 * fVar190 * -0.0;
            auVar49._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
            auVar49._24_4_ = fVar84 * fVar84 * fVar84 * -0.0;
            auVar49._28_4_ = auVar125._28_4_;
            auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar114 = vfmadd231ps_avx512vl(auVar49,auVar110,auVar114);
            auVar50._4_4_ = auVar125._4_4_ * auVar114._4_4_;
            auVar50._0_4_ = auVar125._0_4_ * auVar114._0_4_;
            auVar50._8_4_ = auVar125._8_4_ * auVar114._8_4_;
            auVar50._12_4_ = auVar125._12_4_ * auVar114._12_4_;
            auVar50._16_4_ = auVar125._16_4_ * auVar114._16_4_;
            auVar50._20_4_ = auVar125._20_4_ * auVar114._20_4_;
            auVar50._24_4_ = auVar125._24_4_ * auVar114._24_4_;
            auVar50._28_4_ = 0;
            auVar51._4_4_ = auVar114._4_4_ * -auVar124._4_4_;
            auVar51._0_4_ = auVar114._0_4_ * -auVar124._0_4_;
            auVar51._8_4_ = auVar114._8_4_ * -auVar124._8_4_;
            auVar51._12_4_ = auVar114._12_4_ * -auVar124._12_4_;
            auVar51._16_4_ = auVar114._16_4_ * -auVar124._16_4_;
            auVar51._20_4_ = auVar114._20_4_ * -auVar124._20_4_;
            auVar51._24_4_ = auVar114._24_4_ * -auVar124._24_4_;
            auVar51._28_4_ = auVar125._28_4_;
            auVar109 = vmulps_avx512vl(auVar114,auVar106);
            auVar114 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar106);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar127,auVar127);
            auVar108 = vrsqrt14ps_avx512vl(auVar114);
            auVar114 = vmulps_avx512vl(auVar114,auVar218);
            fVar174 = auVar108._0_4_;
            fVar181 = auVar108._4_4_;
            fVar188 = auVar108._8_4_;
            fVar189 = auVar108._12_4_;
            fVar190 = auVar108._16_4_;
            fVar180 = auVar108._20_4_;
            fVar84 = auVar108._24_4_;
            auVar52._4_4_ = fVar181 * fVar181 * fVar181 * auVar114._4_4_;
            auVar52._0_4_ = fVar174 * fVar174 * fVar174 * auVar114._0_4_;
            auVar52._8_4_ = fVar188 * fVar188 * fVar188 * auVar114._8_4_;
            auVar52._12_4_ = fVar189 * fVar189 * fVar189 * auVar114._12_4_;
            auVar52._16_4_ = fVar190 * fVar190 * fVar190 * auVar114._16_4_;
            auVar52._20_4_ = fVar180 * fVar180 * fVar180 * auVar114._20_4_;
            auVar52._24_4_ = fVar84 * fVar84 * fVar84 * auVar114._24_4_;
            auVar52._28_4_ = auVar114._28_4_;
            auVar114 = vfmadd231ps_avx512vl(auVar52,auVar110,auVar108);
            auVar53._4_4_ = auVar127._4_4_ * auVar114._4_4_;
            auVar53._0_4_ = auVar127._0_4_ * auVar114._0_4_;
            auVar53._8_4_ = auVar127._8_4_ * auVar114._8_4_;
            auVar53._12_4_ = auVar127._12_4_ * auVar114._12_4_;
            auVar53._16_4_ = auVar127._16_4_ * auVar114._16_4_;
            auVar53._20_4_ = auVar127._20_4_ * auVar114._20_4_;
            auVar53._24_4_ = auVar127._24_4_ * auVar114._24_4_;
            auVar53._28_4_ = auVar108._28_4_;
            auVar54._4_4_ = auVar114._4_4_ * auVar112._4_4_;
            auVar54._0_4_ = auVar114._0_4_ * auVar112._0_4_;
            auVar54._8_4_ = auVar114._8_4_ * auVar112._8_4_;
            auVar54._12_4_ = auVar114._12_4_ * auVar112._12_4_;
            auVar54._16_4_ = auVar114._16_4_ * auVar112._16_4_;
            auVar54._20_4_ = auVar114._20_4_ * auVar112._20_4_;
            auVar54._24_4_ = auVar114._24_4_ * auVar112._24_4_;
            auVar54._28_4_ = auVar112._28_4_;
            auVar112 = vmulps_avx512vl(auVar114,auVar106);
            auVar87 = vfmadd213ps_fma(auVar50,ZEXT1632(auVar94),auVar101);
            auVar114 = ZEXT1632(auVar94);
            auVar20 = vfmadd213ps_fma(auVar51,auVar114,auVar103);
            auVar110 = vfmadd213ps_avx512vl(auVar109,auVar114,auVar98);
            auVar108 = vfmadd213ps_avx512vl(auVar53,ZEXT1632(auVar93),auVar104);
            auVar89 = vfnmadd213ps_fma(auVar50,auVar114,auVar101);
            auVar99 = ZEXT1632(auVar93);
            auVar21 = vfmadd213ps_fma(auVar54,auVar99,auVar105);
            auVar24 = vfnmadd213ps_fma(auVar51,auVar114,auVar103);
            auVar88 = vfmadd213ps_fma(auVar112,auVar99,auVar97);
            auVar103 = ZEXT1632(auVar94);
            auVar29 = vfnmadd231ps_fma(auVar98,auVar103,auVar109);
            auVar25 = vfnmadd213ps_fma(auVar53,auVar99,auVar104);
            auVar28 = vfnmadd213ps_fma(auVar54,auVar99,auVar105);
            auVar86 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar93),auVar112);
            auVar97 = vsubps_avx512vl(auVar108,ZEXT1632(auVar89));
            auVar112 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar24));
            auVar114 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar29));
            auVar55._4_4_ = auVar112._4_4_ * auVar29._4_4_;
            auVar55._0_4_ = auVar112._0_4_ * auVar29._0_4_;
            auVar55._8_4_ = auVar112._8_4_ * auVar29._8_4_;
            auVar55._12_4_ = auVar112._12_4_ * auVar29._12_4_;
            auVar55._16_4_ = auVar112._16_4_ * 0.0;
            auVar55._20_4_ = auVar112._20_4_ * 0.0;
            auVar55._24_4_ = auVar112._24_4_ * 0.0;
            auVar55._28_4_ = auVar109._28_4_;
            auVar94 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar24),auVar114);
            auVar56._4_4_ = auVar114._4_4_ * auVar89._4_4_;
            auVar56._0_4_ = auVar114._0_4_ * auVar89._0_4_;
            auVar56._8_4_ = auVar114._8_4_ * auVar89._8_4_;
            auVar56._12_4_ = auVar114._12_4_ * auVar89._12_4_;
            auVar56._16_4_ = auVar114._16_4_ * 0.0;
            auVar56._20_4_ = auVar114._20_4_ * 0.0;
            auVar56._24_4_ = auVar114._24_4_ * 0.0;
            auVar56._28_4_ = auVar114._28_4_;
            auVar22 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar29),auVar97);
            auVar57._4_4_ = auVar24._4_4_ * auVar97._4_4_;
            auVar57._0_4_ = auVar24._0_4_ * auVar97._0_4_;
            auVar57._8_4_ = auVar24._8_4_ * auVar97._8_4_;
            auVar57._12_4_ = auVar24._12_4_ * auVar97._12_4_;
            auVar57._16_4_ = auVar97._16_4_ * 0.0;
            auVar57._20_4_ = auVar97._20_4_ * 0.0;
            auVar57._24_4_ = auVar97._24_4_ * 0.0;
            auVar57._28_4_ = auVar97._28_4_;
            auVar23 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar89),auVar112);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar106,ZEXT1632(auVar22));
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar94));
            uVar74 = vcmpps_avx512vl(auVar112,auVar106,2);
            bVar83 = (byte)uVar74;
            fVar137 = (float)((uint)(bVar83 & 1) * auVar87._0_4_ |
                             (uint)!(bool)(bVar83 & 1) * auVar25._0_4_);
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            fVar139 = (float)((uint)bVar13 * auVar87._4_4_ | (uint)!bVar13 * auVar25._4_4_);
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            fVar142 = (float)((uint)bVar13 * auVar87._8_4_ | (uint)!bVar13 * auVar25._8_4_);
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            fVar143 = (float)((uint)bVar13 * auVar87._12_4_ | (uint)!bVar13 * auVar25._12_4_);
            auVar99 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar142,CONCAT44(fVar139,fVar137))));
            fVar138 = (float)((uint)(bVar83 & 1) * auVar20._0_4_ |
                             (uint)!(bool)(bVar83 & 1) * auVar28._0_4_);
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            fVar141 = (float)((uint)bVar13 * auVar20._4_4_ | (uint)!bVar13 * auVar28._4_4_);
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            fVar140 = (float)((uint)bVar13 * auVar20._8_4_ | (uint)!bVar13 * auVar28._8_4_);
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            fVar144 = (float)((uint)bVar13 * auVar20._12_4_ | (uint)!bVar13 * auVar28._12_4_);
            auVar102 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar140,CONCAT44(fVar141,fVar138))));
            auVar128._0_4_ =
                 (float)((uint)(bVar83 & 1) * auVar110._0_4_ |
                        (uint)!(bool)(bVar83 & 1) * auVar86._0_4_);
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar86._4_4_);
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar86._8_4_);
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar86._12_4_);
            fVar174 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar110._16_4_);
            auVar128._16_4_ = fVar174;
            fVar181 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar110._20_4_);
            auVar128._20_4_ = fVar181;
            fVar188 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar110._24_4_);
            auVar128._24_4_ = fVar188;
            iVar1 = (uint)(byte)(uVar74 >> 7) * auVar110._28_4_;
            auVar128._28_4_ = iVar1;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar89),auVar108);
            auVar129._0_4_ =
                 (uint)(bVar83 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar94._0_4_;
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar94._4_4_;
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar94._8_4_;
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar94._12_4_;
            auVar129._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * auVar112._16_4_;
            auVar129._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * auVar112._20_4_;
            auVar129._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * auVar112._24_4_;
            auVar129._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar24),ZEXT1632(auVar21));
            auVar130._0_4_ =
                 (float)((uint)(bVar83 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar83 & 1) * auVar87._0_4_);
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar130._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar87._4_4_);
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar130._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar87._8_4_);
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar130._12_4_ =
                 (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar87._12_4_);
            fVar189 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar112._16_4_);
            auVar130._16_4_ = fVar189;
            fVar190 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar112._20_4_);
            auVar130._20_4_ = fVar190;
            fVar180 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar112._24_4_);
            auVar130._24_4_ = fVar180;
            auVar130._28_4_ = (uint)(byte)(uVar74 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar88));
            auVar131._0_4_ =
                 (float)((uint)(bVar83 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar83 & 1) * auVar20._0_4_);
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar20._4_4_);
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar20._8_4_);
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar20._12_4_);
            fVar136 = (float)((uint)((byte)(uVar74 >> 4) & 1) * auVar112._16_4_);
            auVar131._16_4_ = fVar136;
            fVar85 = (float)((uint)((byte)(uVar74 >> 5) & 1) * auVar112._20_4_);
            auVar131._20_4_ = fVar85;
            fVar84 = (float)((uint)((byte)(uVar74 >> 6) & 1) * auVar112._24_4_);
            auVar131._24_4_ = fVar84;
            iVar2 = (uint)(byte)(uVar74 >> 7) * auVar112._28_4_;
            auVar131._28_4_ = iVar2;
            auVar132._0_4_ =
                 (uint)(bVar83 & 1) * (int)auVar89._0_4_ |
                 (uint)!(bool)(bVar83 & 1) * auVar108._0_4_;
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            auVar132._4_4_ = (uint)bVar13 * (int)auVar89._4_4_ | (uint)!bVar13 * auVar108._4_4_;
            bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
            auVar132._8_4_ = (uint)bVar13 * (int)auVar89._8_4_ | (uint)!bVar13 * auVar108._8_4_;
            bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar132._12_4_ = (uint)bVar13 * (int)auVar89._12_4_ | (uint)!bVar13 * auVar108._12_4_;
            auVar132._16_4_ = (uint)!(bool)((byte)(uVar74 >> 4) & 1) * auVar108._16_4_;
            auVar132._20_4_ = (uint)!(bool)((byte)(uVar74 >> 5) & 1) * auVar108._20_4_;
            auVar132._24_4_ = (uint)!(bool)((byte)(uVar74 >> 6) & 1) * auVar108._24_4_;
            auVar132._28_4_ = (uint)!SUB81(uVar74 >> 7,0) * auVar108._28_4_;
            bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar74 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar74 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar74 >> 3) & 1);
            auVar108 = vsubps_avx512vl(auVar132,auVar99);
            auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar24._12_4_ |
                                                     (uint)!bVar17 * auVar21._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar24._8_4_ |
                                                              (uint)!bVar15 * auVar21._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar24._4_4_ |
                                                                       (uint)!bVar13 * auVar21._4_4_
                                                                       ,(uint)(bVar83 & 1) *
                                                                        (int)auVar24._0_4_ |
                                                                        (uint)!(bool)(bVar83 & 1) *
                                                                        auVar21._0_4_)))),auVar102);
            auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar29._12_4_ |
                                                     (uint)!bVar18 * auVar88._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar29._8_4_ |
                                                              (uint)!bVar16 * auVar88._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar29._4_4_ |
                                                                       (uint)!bVar14 * auVar88._4_4_
                                                                       ,(uint)(bVar83 & 1) *
                                                                        (int)auVar29._0_4_ |
                                                                        (uint)!(bool)(bVar83 & 1) *
                                                                        auVar88._0_4_)))),auVar128);
            auVar109 = vsubps_avx(auVar99,auVar129);
            auVar97 = vsubps_avx(auVar102,auVar130);
            auVar98 = vsubps_avx(auVar128,auVar131);
            auVar58._4_4_ = auVar110._4_4_ * fVar139;
            auVar58._0_4_ = auVar110._0_4_ * fVar137;
            auVar58._8_4_ = auVar110._8_4_ * fVar142;
            auVar58._12_4_ = auVar110._12_4_ * fVar143;
            auVar58._16_4_ = auVar110._16_4_ * 0.0;
            auVar58._20_4_ = auVar110._20_4_ * 0.0;
            auVar58._24_4_ = auVar110._24_4_ * 0.0;
            auVar58._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar58,auVar128,auVar108);
            auVar179._0_4_ = fVar138 * auVar108._0_4_;
            auVar179._4_4_ = fVar141 * auVar108._4_4_;
            auVar179._8_4_ = fVar140 * auVar108._8_4_;
            auVar179._12_4_ = fVar144 * auVar108._12_4_;
            auVar179._16_4_ = auVar108._16_4_ * 0.0;
            auVar179._20_4_ = auVar108._20_4_ * 0.0;
            auVar179._24_4_ = auVar108._24_4_ * 0.0;
            auVar179._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar179,auVar99,auVar114);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar106,ZEXT1632(auVar94));
            auVar186._0_4_ = auVar114._0_4_ * auVar128._0_4_;
            auVar186._4_4_ = auVar114._4_4_ * auVar128._4_4_;
            auVar186._8_4_ = auVar114._8_4_ * auVar128._8_4_;
            auVar186._12_4_ = auVar114._12_4_ * auVar128._12_4_;
            auVar186._16_4_ = auVar114._16_4_ * fVar174;
            auVar186._20_4_ = auVar114._20_4_ * fVar181;
            auVar186._24_4_ = auVar114._24_4_ * fVar188;
            auVar186._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar186,auVar102,auVar110);
            auVar100 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar94));
            auVar112 = vmulps_avx512vl(auVar98,auVar129);
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar109,auVar131);
            auVar59._4_4_ = auVar97._4_4_ * auVar131._4_4_;
            auVar59._0_4_ = auVar97._0_4_ * auVar131._0_4_;
            auVar59._8_4_ = auVar97._8_4_ * auVar131._8_4_;
            auVar59._12_4_ = auVar97._12_4_ * auVar131._12_4_;
            auVar59._16_4_ = auVar97._16_4_ * fVar136;
            auVar59._20_4_ = auVar97._20_4_ * fVar85;
            auVar59._24_4_ = auVar97._24_4_ * fVar84;
            auVar59._28_4_ = iVar2;
            auVar94 = vfmsub231ps_fma(auVar59,auVar130,auVar98);
            auVar187._0_4_ = auVar130._0_4_ * auVar109._0_4_;
            auVar187._4_4_ = auVar130._4_4_ * auVar109._4_4_;
            auVar187._8_4_ = auVar130._8_4_ * auVar109._8_4_;
            auVar187._12_4_ = auVar130._12_4_ * auVar109._12_4_;
            auVar187._16_4_ = fVar189 * auVar109._16_4_;
            auVar187._20_4_ = fVar190 * auVar109._20_4_;
            auVar187._24_4_ = fVar180 * auVar109._24_4_;
            auVar187._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar187,auVar97,auVar129);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar106,auVar112);
            auVar101 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar94));
            auVar112 = vmaxps_avx(auVar100,auVar101);
            uVar146 = vcmpps_avx512vl(auVar112,auVar106,2);
            local_230 = local_230 & (byte)uVar146;
            if (local_230 == 0) {
LAB_01c7e89c:
              local_230 = 0;
            }
            else {
              auVar60._4_4_ = auVar98._4_4_ * auVar114._4_4_;
              auVar60._0_4_ = auVar98._0_4_ * auVar114._0_4_;
              auVar60._8_4_ = auVar98._8_4_ * auVar114._8_4_;
              auVar60._12_4_ = auVar98._12_4_ * auVar114._12_4_;
              auVar60._16_4_ = auVar98._16_4_ * auVar114._16_4_;
              auVar60._20_4_ = auVar98._20_4_ * auVar114._20_4_;
              auVar60._24_4_ = auVar98._24_4_ * auVar114._24_4_;
              auVar60._28_4_ = auVar112._28_4_;
              auVar20 = vfmsub231ps_fma(auVar60,auVar97,auVar110);
              auVar61._4_4_ = auVar110._4_4_ * auVar109._4_4_;
              auVar61._0_4_ = auVar110._0_4_ * auVar109._0_4_;
              auVar61._8_4_ = auVar110._8_4_ * auVar109._8_4_;
              auVar61._12_4_ = auVar110._12_4_ * auVar109._12_4_;
              auVar61._16_4_ = auVar110._16_4_ * auVar109._16_4_;
              auVar61._20_4_ = auVar110._20_4_ * auVar109._20_4_;
              auVar61._24_4_ = auVar110._24_4_ * auVar109._24_4_;
              auVar61._28_4_ = auVar110._28_4_;
              auVar87 = vfmsub231ps_fma(auVar61,auVar108,auVar98);
              auVar62._4_4_ = auVar97._4_4_ * auVar108._4_4_;
              auVar62._0_4_ = auVar97._0_4_ * auVar108._0_4_;
              auVar62._8_4_ = auVar97._8_4_ * auVar108._8_4_;
              auVar62._12_4_ = auVar97._12_4_ * auVar108._12_4_;
              auVar62._16_4_ = auVar97._16_4_ * auVar108._16_4_;
              auVar62._20_4_ = auVar97._20_4_ * auVar108._20_4_;
              auVar62._24_4_ = auVar97._24_4_ * auVar108._24_4_;
              auVar62._28_4_ = auVar97._28_4_;
              auVar21 = vfmsub231ps_fma(auVar62,auVar109,auVar114);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar21));
              auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar20),auVar106);
              auVar114 = vrcp14ps_avx512vl(auVar112);
              auVar35._8_4_ = 0x3f800000;
              auVar35._0_8_ = &DAT_3f8000003f800000;
              auVar35._12_4_ = 0x3f800000;
              auVar35._16_4_ = 0x3f800000;
              auVar35._20_4_ = 0x3f800000;
              auVar35._24_4_ = 0x3f800000;
              auVar35._28_4_ = 0x3f800000;
              auVar110 = vfnmadd213ps_avx512vl(auVar114,auVar112,auVar35);
              auVar94 = vfmadd132ps_fma(auVar110,auVar114,auVar114);
              auVar63._4_4_ = auVar21._4_4_ * auVar128._4_4_;
              auVar63._0_4_ = auVar21._0_4_ * auVar128._0_4_;
              auVar63._8_4_ = auVar21._8_4_ * auVar128._8_4_;
              auVar63._12_4_ = auVar21._12_4_ * auVar128._12_4_;
              auVar63._16_4_ = fVar174 * 0.0;
              auVar63._20_4_ = fVar181 * 0.0;
              auVar63._24_4_ = fVar188 * 0.0;
              auVar63._28_4_ = iVar1;
              auVar87 = vfmadd231ps_fma(auVar63,auVar102,ZEXT1632(auVar87));
              auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar99,ZEXT1632(auVar20));
              fVar181 = auVar94._0_4_;
              fVar188 = auVar94._4_4_;
              fVar189 = auVar94._8_4_;
              fVar190 = auVar94._12_4_;
              auVar114 = ZEXT1632(CONCAT412(auVar87._12_4_ * fVar190,
                                            CONCAT48(auVar87._8_4_ * fVar189,
                                                     CONCAT44(auVar87._4_4_ * fVar188,
                                                              auVar87._0_4_ * fVar181))));
              auVar71._4_4_ = uStack_31c;
              auVar71._0_4_ = local_320;
              auVar71._8_4_ = uStack_318;
              auVar71._12_4_ = uStack_314;
              auVar71._16_4_ = uStack_310;
              auVar71._20_4_ = uStack_30c;
              auVar71._24_4_ = uStack_308;
              auVar71._28_4_ = uStack_304;
              uVar146 = vcmpps_avx512vl(auVar114,auVar71,0xd);
              fVar174 = (ray->super_RayK<1>).tfar;
              auVar36._4_4_ = fVar174;
              auVar36._0_4_ = fVar174;
              auVar36._8_4_ = fVar174;
              auVar36._12_4_ = fVar174;
              auVar36._16_4_ = fVar174;
              auVar36._20_4_ = fVar174;
              auVar36._24_4_ = fVar174;
              auVar36._28_4_ = fVar174;
              uVar26 = vcmpps_avx512vl(auVar114,auVar36,2);
              local_230 = (byte)uVar146 & (byte)uVar26 & local_230;
              if (local_230 == 0) goto LAB_01c7e89c;
              uVar146 = vcmpps_avx512vl(auVar112,auVar106,4);
              if ((local_230 & (byte)uVar146) == 0) {
                local_230 = 0;
              }
              else {
                local_230 = local_230 & (byte)uVar146;
                fVar174 = auVar100._0_4_ * fVar181;
                fVar180 = auVar100._4_4_ * fVar188;
                auVar64._4_4_ = fVar180;
                auVar64._0_4_ = fVar174;
                fVar84 = auVar100._8_4_ * fVar189;
                auVar64._8_4_ = fVar84;
                fVar85 = auVar100._12_4_ * fVar190;
                auVar64._12_4_ = fVar85;
                fVar136 = auVar100._16_4_ * 0.0;
                auVar64._16_4_ = fVar136;
                fVar137 = auVar100._20_4_ * 0.0;
                auVar64._20_4_ = fVar137;
                fVar138 = auVar100._24_4_ * 0.0;
                auVar64._24_4_ = fVar138;
                auVar64._28_4_ = auVar100._28_4_;
                fVar181 = auVar101._0_4_ * fVar181;
                fVar188 = auVar101._4_4_ * fVar188;
                auVar65._4_4_ = fVar188;
                auVar65._0_4_ = fVar181;
                fVar189 = auVar101._8_4_ * fVar189;
                auVar65._8_4_ = fVar189;
                fVar190 = auVar101._12_4_ * fVar190;
                auVar65._12_4_ = fVar190;
                fVar139 = auVar101._16_4_ * 0.0;
                auVar65._16_4_ = fVar139;
                fVar141 = auVar101._20_4_ * 0.0;
                auVar65._20_4_ = fVar141;
                fVar142 = auVar101._24_4_ * 0.0;
                auVar65._24_4_ = fVar142;
                auVar65._28_4_ = auVar101._28_4_;
                auVar198._8_4_ = 0x3f800000;
                auVar198._0_8_ = &DAT_3f8000003f800000;
                auVar198._12_4_ = 0x3f800000;
                auVar198._16_4_ = 0x3f800000;
                auVar198._20_4_ = 0x3f800000;
                auVar198._24_4_ = 0x3f800000;
                auVar198._28_4_ = 0x3f800000;
                auVar112 = vsubps_avx(auVar198,auVar64);
                local_500._0_4_ =
                     (uint)(bVar83 & 1) * (int)fVar174 | (uint)!(bool)(bVar83 & 1) * auVar112._0_4_;
                bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                local_500._4_4_ = (uint)bVar13 * (int)fVar180 | (uint)!bVar13 * auVar112._4_4_;
                bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                local_500._8_4_ = (uint)bVar13 * (int)fVar84 | (uint)!bVar13 * auVar112._8_4_;
                bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
                local_500._12_4_ = (uint)bVar13 * (int)fVar85 | (uint)!bVar13 * auVar112._12_4_;
                bVar13 = (bool)((byte)(uVar74 >> 4) & 1);
                local_500._16_4_ = (uint)bVar13 * (int)fVar136 | (uint)!bVar13 * auVar112._16_4_;
                bVar13 = (bool)((byte)(uVar74 >> 5) & 1);
                local_500._20_4_ = (uint)bVar13 * (int)fVar137 | (uint)!bVar13 * auVar112._20_4_;
                bVar13 = (bool)((byte)(uVar74 >> 6) & 1);
                local_500._24_4_ = (uint)bVar13 * (int)fVar138 | (uint)!bVar13 * auVar112._24_4_;
                bVar13 = SUB81(uVar74 >> 7,0);
                local_500._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar112._28_4_;
                auVar112 = vsubps_avx(auVar198,auVar65);
                bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar74 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar74 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar74 >> 6) & 1);
                bVar19 = SUB81(uVar74 >> 7,0);
                local_1c0._4_4_ = (uint)bVar13 * (int)fVar188 | (uint)!bVar13 * auVar112._4_4_;
                local_1c0._0_4_ =
                     (uint)(bVar83 & 1) * (int)fVar181 | (uint)!(bool)(bVar83 & 1) * auVar112._0_4_;
                local_1c0._8_4_ = (uint)bVar14 * (int)fVar189 | (uint)!bVar14 * auVar112._8_4_;
                local_1c0._12_4_ = (uint)bVar15 * (int)fVar190 | (uint)!bVar15 * auVar112._12_4_;
                local_1c0._16_4_ = (uint)bVar16 * (int)fVar139 | (uint)!bVar16 * auVar112._16_4_;
                local_1c0._20_4_ = (uint)bVar17 * (int)fVar141 | (uint)!bVar17 * auVar112._20_4_;
                local_1c0._24_4_ = (uint)bVar18 * (int)fVar142 | (uint)!bVar18 * auVar112._24_4_;
                local_1c0._28_4_ = (uint)bVar19 * auVar101._28_4_ | (uint)!bVar19 * auVar112._28_4_;
                local_520 = auVar114;
              }
            }
            auVar220 = ZEXT3264(auVar113);
            if (local_230 != 0) {
              auVar112 = vsubps_avx(ZEXT1632(auVar93),auVar103);
              auVar94 = vfmadd213ps_fma(auVar112,local_500,auVar103);
              fVar174 = local_5e8->depth_scale;
              auVar37._4_4_ = fVar174;
              auVar37._0_4_ = fVar174;
              auVar37._8_4_ = fVar174;
              auVar37._12_4_ = fVar174;
              auVar37._16_4_ = fVar174;
              auVar37._20_4_ = fVar174;
              auVar37._24_4_ = fVar174;
              auVar37._28_4_ = fVar174;
              auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                            CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                     CONCAT44(auVar94._4_4_ +
                                                                              auVar94._4_4_,
                                                                              auVar94._0_4_ +
                                                                              auVar94._0_4_)))),
                                         auVar37);
              uVar146 = vcmpps_avx512vl(local_520,auVar112,6);
              local_230 = local_230 & (byte)uVar146;
              uVar81 = (uint)local_230;
              if (local_230 != 0) {
                auVar152._8_4_ = 0xbf800000;
                auVar152._0_8_ = 0xbf800000bf800000;
                auVar152._12_4_ = 0xbf800000;
                auVar152._16_4_ = 0xbf800000;
                auVar152._20_4_ = 0xbf800000;
                auVar152._24_4_ = 0xbf800000;
                auVar152._28_4_ = 0xbf800000;
                auVar38._8_4_ = 0x40000000;
                auVar38._0_8_ = 0x4000000040000000;
                auVar38._12_4_ = 0x40000000;
                auVar38._16_4_ = 0x40000000;
                auVar38._20_4_ = 0x40000000;
                auVar38._24_4_ = 0x40000000;
                auVar38._28_4_ = 0x40000000;
                local_1c0 = vfmadd132ps_avx512vl(local_1c0,auVar152,auVar38);
                local_2e0 = local_500;
                auVar112 = local_1c0;
                local_2c0 = local_1c0;
                local_2a0 = local_520;
                local_280 = (int)lVar80;
                local_27c = iVar8;
                local_270 = local_5b0._0_8_;
                uStack_268 = local_5b0._8_8_;
                local_260 = local_540._0_8_;
                uStack_258 = local_540._8_8_;
                local_250 = local_550._0_8_;
                uStack_248 = local_550._8_8_;
                local_240 = local_530;
                uStack_238 = uStack_528;
                pGVar79 = (context->scene->geometries).items[local_5f8].ptr;
                local_1c0 = auVar112;
                if ((pGVar79->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar94 = vcvtsi2ss_avx512f(auVar107._0_16_,(int)lVar80);
                  fVar174 = auVar94._0_4_;
                  local_220[0] = (fVar174 + local_500._0_4_ + 0.0) * (float)local_300._0_4_;
                  local_220[1] = (fVar174 + local_500._4_4_ + 1.0) * (float)local_300._4_4_;
                  local_220[2] = (fVar174 + local_500._8_4_ + 2.0) * fStack_2f8;
                  local_220[3] = (fVar174 + local_500._12_4_ + 3.0) * fStack_2f4;
                  fStack_210 = (fVar174 + local_500._16_4_ + 4.0) * fStack_2f0;
                  fStack_20c = (fVar174 + local_500._20_4_ + 5.0) * fStack_2ec;
                  fStack_208 = (fVar174 + local_500._24_4_ + 6.0) * fStack_2e8;
                  fStack_204 = fVar174 + local_500._28_4_ + 7.0;
                  local_200 = local_1c0._0_8_;
                  uStack_1f8 = local_1c0._8_8_;
                  uStack_1f0 = local_1c0._16_8_;
                  uStack_1e8 = local_1c0._24_8_;
                  local_1e0 = local_520;
                  auVar153._8_4_ = 0x7f800000;
                  auVar153._0_8_ = 0x7f8000007f800000;
                  auVar153._12_4_ = 0x7f800000;
                  auVar153._16_4_ = 0x7f800000;
                  auVar153._20_4_ = 0x7f800000;
                  auVar153._24_4_ = 0x7f800000;
                  auVar153._28_4_ = 0x7f800000;
                  auVar114 = vblendmps_avx512vl(auVar153,local_520);
                  auVar133._0_4_ =
                       (uint)(local_230 & 1) * auVar114._0_4_ |
                       (uint)!(bool)(local_230 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_230 >> 1 & 1);
                  auVar133._4_4_ = (uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_230 >> 2 & 1);
                  auVar133._8_4_ = (uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_230 >> 3 & 1);
                  auVar133._12_4_ = (uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_230 >> 4 & 1);
                  auVar133._16_4_ = (uint)bVar13 * auVar114._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_230 >> 5 & 1);
                  auVar133._20_4_ = (uint)bVar13 * auVar114._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_230 >> 6 & 1);
                  auVar133._24_4_ = (uint)bVar13 * auVar114._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar133._28_4_ =
                       (uint)(local_230 >> 7) * auVar114._28_4_ |
                       (uint)!(bool)(local_230 >> 7) * 0x7f800000;
                  auVar114 = vshufps_avx(auVar133,auVar133,0xb1);
                  auVar114 = vminps_avx(auVar133,auVar114);
                  auVar110 = vshufpd_avx(auVar114,auVar114,5);
                  auVar114 = vminps_avx(auVar114,auVar110);
                  auVar110 = vpermpd_avx2(auVar114,0x4e);
                  auVar114 = vminps_avx(auVar114,auVar110);
                  uVar146 = vcmpps_avx512vl(auVar133,auVar114,0);
                  bVar73 = (byte)uVar146 & local_230;
                  bVar83 = local_230;
                  if (bVar73 != 0) {
                    bVar83 = bVar73;
                  }
                  uVar77 = 0;
                  for (uVar76 = (uint)bVar83; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000)
                  {
                    uVar77 = uVar77 + 1;
                  }
                  uVar74 = (ulong)uVar77;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar79->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar174 = local_220[uVar74];
                    fVar181 = *(float *)((long)&local_200 + uVar74 * 4);
                    fVar189 = 1.0 - fVar174;
                    fVar188 = fVar189 * fVar189 * -3.0;
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar189 * fVar189)),
                                              ZEXT416((uint)(fVar174 * fVar189)),ZEXT416(0xc0000000)
                                             );
                    auVar93 = vfmsub132ss_fma(ZEXT416((uint)(fVar174 * fVar189)),
                                              ZEXT416((uint)(fVar174 * fVar174)),ZEXT416(0x40000000)
                                             );
                    fVar189 = auVar94._0_4_ * 3.0;
                    fVar190 = auVar93._0_4_ * 3.0;
                    fVar180 = fVar174 * fVar174 * 3.0;
                    auVar194._0_4_ = fVar180 * (float)local_530._0_4_;
                    auVar194._4_4_ = fVar180 * (float)local_530._4_4_;
                    auVar194._8_4_ = fVar180 * (float)uStack_528;
                    auVar194._12_4_ = fVar180 * uStack_528._4_4_;
                    auVar168._4_4_ = fVar190;
                    auVar168._0_4_ = fVar190;
                    auVar168._8_4_ = fVar190;
                    auVar168._12_4_ = fVar190;
                    auVar94 = vfmadd132ps_fma(auVar168,auVar194,local_550);
                    auVar176._4_4_ = fVar189;
                    auVar176._0_4_ = fVar189;
                    auVar176._8_4_ = fVar189;
                    auVar176._12_4_ = fVar189;
                    auVar94 = vfmadd132ps_fma(auVar176,auVar94,local_540);
                    auVar169._4_4_ = fVar188;
                    auVar169._0_4_ = fVar188;
                    auVar169._8_4_ = fVar188;
                    auVar169._12_4_ = fVar188;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar74 * 4);
                    auVar94 = vfmadd132ps_fma(auVar169,auVar94,local_5b0);
                    uVar146 = vmovlps_avx(auVar94);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar146;
                    fVar188 = (float)vextractps_avx(auVar94,2);
                    (ray->Ng).field_0.field_0.z = fVar188;
                    ray->u = fVar174;
                    ray->v = fVar181;
                    ray->primID = (uint)local_5f0;
                    ray->geomID = (uint)local_5f8;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    local_4a0 = local_540._0_8_;
                    uStack_498 = local_540._8_8_;
                    local_4b0 = local_550._0_4_;
                    fStack_4ac = local_550._4_4_;
                    fStack_4a8 = local_550._8_4_;
                    fStack_4a4 = local_550._12_4_;
                    _local_560 = _local_530;
                    local_568 = pGVar79;
                    local_600 = prim;
                    local_160 = vmovdqa64_avx512vl(auVar215._0_32_);
                    do {
                      auVar87 = auVar221._0_16_;
                      local_594 = local_220[uVar74];
                      local_590 = *(undefined4 *)((long)&local_200 + uVar74 * 4);
                      local_490 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_1e0 + uVar74 * 4);
                      local_5e0.context = context->user;
                      fVar181 = 1.0 - local_594;
                      fVar174 = fVar181 * fVar181 * -3.0;
                      auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar181 * fVar181)),
                                                ZEXT416((uint)(local_594 * fVar181)),
                                                ZEXT416(0xc0000000));
                      auVar93 = vfmsub132ss_fma(ZEXT416((uint)(local_594 * fVar181)),
                                                ZEXT416((uint)(local_594 * local_594)),
                                                ZEXT416(0x40000000));
                      fVar181 = auVar94._0_4_ * 3.0;
                      fVar188 = auVar93._0_4_ * 3.0;
                      fVar189 = local_594 * local_594 * 3.0;
                      auVar195._0_4_ = fVar189 * (float)local_560._0_4_;
                      auVar195._4_4_ = fVar189 * (float)local_560._4_4_;
                      auVar195._8_4_ = fVar189 * fStack_558;
                      auVar195._12_4_ = fVar189 * fStack_554;
                      auVar170._4_4_ = fVar188;
                      auVar170._0_4_ = fVar188;
                      auVar170._8_4_ = fVar188;
                      auVar170._12_4_ = fVar188;
                      auVar66._4_4_ = fStack_4ac;
                      auVar66._0_4_ = local_4b0;
                      auVar66._8_4_ = fStack_4a8;
                      auVar66._12_4_ = fStack_4a4;
                      auVar94 = vfmadd132ps_fma(auVar170,auVar195,auVar66);
                      auVar177._4_4_ = fVar181;
                      auVar177._0_4_ = fVar181;
                      auVar177._8_4_ = fVar181;
                      auVar177._12_4_ = fVar181;
                      auVar67._8_8_ = uStack_498;
                      auVar67._0_8_ = local_4a0;
                      auVar94 = vfmadd132ps_fma(auVar177,auVar94,auVar67);
                      auVar171._4_4_ = fVar174;
                      auVar171._0_4_ = fVar174;
                      auVar171._8_4_ = fVar174;
                      auVar171._12_4_ = fVar174;
                      auVar94 = vfmadd132ps_fma(auVar171,auVar94,local_5b0);
                      local_5a0 = vmovlps_avx(auVar94);
                      local_598 = vextractps_avx(auVar94,2);
                      local_58c = (int)local_5f0;
                      local_588 = (int)local_5f8;
                      local_584 = (local_5e0.context)->instID[0];
                      local_580 = (local_5e0.context)->instPrimID[0];
                      local_604 = -1;
                      local_5e0.valid = &local_604;
                      local_5e0.geometryUserPtr = pGVar79->userPtr;
                      local_5e0.ray = (RTCRayN *)ray;
                      local_5e0.hit = (RTCHitN *)&local_5a0;
                      local_5e0.N = 1;
                      if (pGVar79->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c7eb1f:
                        auVar94 = auVar221._0_16_;
                        p_Var12 = context->args->filter;
                        if (p_Var12 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar79->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var12)(&local_5e0);
                            auVar112 = vmovdqa64_avx512vl(local_160);
                            auVar215 = ZEXT3264(auVar112);
                            auVar228 = ZEXT3264(local_3a0);
                            auVar227 = ZEXT3264(local_380);
                            auVar226 = ZEXT3264(local_420);
                            auVar225 = ZEXT3264(local_400);
                            auVar224 = ZEXT3264(local_360);
                            auVar223 = ZEXT3264(local_3e0);
                            auVar222 = ZEXT3264(local_340);
                            auVar220 = ZEXT3264(local_3c0);
                            auVar94 = vxorps_avx512vl(auVar94,auVar94);
                            auVar221 = ZEXT1664(auVar94);
                            pGVar79 = local_568;
                            prim = local_600;
                          }
                          if (*local_5e0.valid == 0) goto LAB_01c7ec15;
                        }
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).components[0] =
                             *(float *)local_5e0.hit;
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_5e0.hit + 4);
                        (((Vec3f *)((long)local_5e0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_5e0.hit + 8);
                        *(float *)((long)local_5e0.ray + 0x3c) = *(float *)(local_5e0.hit + 0xc);
                        *(float *)((long)local_5e0.ray + 0x40) = *(float *)(local_5e0.hit + 0x10);
                        *(float *)((long)local_5e0.ray + 0x44) = *(float *)(local_5e0.hit + 0x14);
                        *(float *)((long)local_5e0.ray + 0x48) = *(float *)(local_5e0.hit + 0x18);
                        *(float *)((long)local_5e0.ray + 0x4c) = *(float *)(local_5e0.hit + 0x1c);
                        *(float *)((long)local_5e0.ray + 0x50) = *(float *)(local_5e0.hit + 0x20);
                      }
                      else {
                        (*pGVar79->intersectionFilterN)(&local_5e0);
                        auVar112 = vmovdqa64_avx512vl(local_160);
                        auVar215 = ZEXT3264(auVar112);
                        auVar228 = ZEXT3264(local_3a0);
                        auVar227 = ZEXT3264(local_380);
                        auVar226 = ZEXT3264(local_420);
                        auVar225 = ZEXT3264(local_400);
                        auVar224 = ZEXT3264(local_360);
                        auVar223 = ZEXT3264(local_3e0);
                        auVar222 = ZEXT3264(local_340);
                        auVar220 = ZEXT3264(local_3c0);
                        auVar94 = vxorps_avx512vl(auVar87,auVar87);
                        auVar221 = ZEXT1664(auVar94);
                        pGVar79 = local_568;
                        prim = local_600;
                        if (*local_5e0.valid != 0) goto LAB_01c7eb1f;
LAB_01c7ec15:
                        (ray->super_RayK<1>).tfar = local_490;
                      }
                      bVar73 = ~(byte)(1 << ((uint)uVar74 & 0x1f)) & (byte)uVar81;
                      fVar174 = (ray->super_RayK<1>).tfar;
                      auVar39._4_4_ = fVar174;
                      auVar39._0_4_ = fVar174;
                      auVar39._8_4_ = fVar174;
                      auVar39._12_4_ = fVar174;
                      auVar39._16_4_ = fVar174;
                      auVar39._20_4_ = fVar174;
                      auVar39._24_4_ = fVar174;
                      auVar39._28_4_ = fVar174;
                      uVar146 = vcmpps_avx512vl(local_520,auVar39,2);
                      bVar83 = bVar73 & (byte)uVar146;
                      uVar81 = (uint)bVar83;
                      if ((bVar73 & (byte)uVar146) != 0) {
                        auVar154._8_4_ = 0x7f800000;
                        auVar154._0_8_ = 0x7f8000007f800000;
                        auVar154._12_4_ = 0x7f800000;
                        auVar154._16_4_ = 0x7f800000;
                        auVar154._20_4_ = 0x7f800000;
                        auVar154._24_4_ = 0x7f800000;
                        auVar154._28_4_ = 0x7f800000;
                        auVar112 = vblendmps_avx512vl(auVar154,local_520);
                        auVar134._0_4_ =
                             (uint)(bVar83 & 1) * auVar112._0_4_ |
                             (uint)!(bool)(bVar83 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar83 >> 1 & 1);
                        auVar134._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar83 >> 2 & 1);
                        auVar134._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar83 >> 3 & 1);
                        auVar134._12_4_ =
                             (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar83 >> 4 & 1);
                        auVar134._16_4_ =
                             (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar83 >> 5 & 1);
                        auVar134._20_4_ =
                             (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar83 >> 6 & 1);
                        auVar134._24_4_ =
                             (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar134._28_4_ =
                             (uint)(bVar83 >> 7) * auVar112._28_4_ |
                             (uint)!(bool)(bVar83 >> 7) * 0x7f800000;
                        auVar112 = vshufps_avx(auVar134,auVar134,0xb1);
                        auVar112 = vminps_avx(auVar134,auVar112);
                        auVar114 = vshufpd_avx(auVar112,auVar112,5);
                        auVar112 = vminps_avx(auVar112,auVar114);
                        auVar114 = vpermpd_avx2(auVar112,0x4e);
                        auVar112 = vminps_avx(auVar112,auVar114);
                        uVar146 = vcmpps_avx512vl(auVar134,auVar112,0);
                        bVar73 = (byte)uVar146 & bVar83;
                        uVar77 = uVar81;
                        if (bVar73 != 0) {
                          uVar77 = (uint)bVar73;
                        }
                        uVar76 = 0;
                        for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                          uVar76 = uVar76 + 1;
                        }
                        uVar74 = (ulong)uVar76;
                      }
                    } while (bVar83 != 0);
                  }
                }
              }
            }
          }
          lVar80 = lVar80 + 8;
        } while ((int)lVar80 < iVar8);
      }
      fVar174 = (ray->super_RayK<1>).tfar;
      auVar31._4_4_ = fVar174;
      auVar31._0_4_ = fVar174;
      auVar31._8_4_ = fVar174;
      auVar31._12_4_ = fVar174;
      uVar146 = vcmpps_avx512vl(local_170,auVar31,2);
      uVar81 = (uint)uVar82 & (uint)uVar82 + 0xf & (uint)uVar146;
      uVar82 = (ulong)uVar81;
    } while (uVar81 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }